

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  ulong uVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar99;
  byte bVar100;
  uint uVar101;
  long lVar102;
  long lVar103;
  ulong uVar104;
  uint uVar105;
  bool bVar106;
  byte bVar107;
  float fVar108;
  float fVar133;
  float fVar135;
  vint4 bi;
  float fVar137;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar140;
  float fVar142;
  float fVar144;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  undefined1 auVar124 [32];
  float fVar139;
  float fVar141;
  float fVar143;
  float fVar145;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar146;
  float fVar170;
  float fVar171;
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar172;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar173;
  float fVar199;
  float fVar200;
  vint4 bi_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar201;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar192 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [28];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar233;
  float fVar252;
  float fVar253;
  vint4 bi_1;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [28];
  float fVar255;
  float fVar256;
  undefined1 auVar243 [32];
  float fVar254;
  float fVar258;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar260;
  undefined1 auVar247 [32];
  float fVar257;
  float fVar259;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar261;
  float fVar262;
  float fVar270;
  float fVar274;
  vint4 ai_2;
  undefined1 auVar263 [16];
  float fVar278;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar267 [28];
  undefined1 auVar268 [32];
  float fVar282;
  float fVar285;
  undefined1 auVar269 [64];
  float fVar291;
  float fVar298;
  float fVar300;
  undefined1 auVar293 [16];
  float fVar292;
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar302;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar297 [64];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar316;
  float fVar319;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar317;
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar337;
  float fVar345;
  float fVar346;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar348;
  float fVar349;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar347;
  undefined1 auVar344 [64];
  float fVar350;
  float fVar354;
  float fVar355;
  undefined1 auVar351 [16];
  float fVar356;
  float fVar360;
  undefined1 auVar352 [32];
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar353 [64];
  float fVar361;
  float fVar367;
  float fVar368;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar369;
  float fVar373;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar366 [64];
  float fVar374;
  float fVar379;
  float fVar380;
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar377 [32];
  float fVar385;
  float fVar386;
  float fVar389;
  float fVar391;
  undefined1 auVar387 [16];
  float fVar390;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar388 [32];
  undefined1 auVar401 [16];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar404;
  float fVar406;
  float fVar407;
  undefined1 auVar405 [32];
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c88;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined1 local_bf0 [8];
  float fStack_be8;
  float fStack_be4;
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float local_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  RTCHitN local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  uint local_7d0;
  uint uStack_7cc;
  uint uStack_7c8;
  uint uStack_7c4;
  uint uStack_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar378 [64];
  
  PVar9 = prim[1];
  uVar97 = (ulong)(byte)PVar9;
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  lVar102 = uVar97 * 0x25;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x11 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 6)));
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 6)));
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar291 = *(float *)(prim + lVar102 + 0x12);
  auVar18 = vsubps_avx(auVar18,*(undefined1 (*) [16])(prim + lVar102 + 6));
  local_bf0._4_4_ = fVar291 * auVar18._4_4_;
  local_bf0._0_4_ = fVar291 * auVar18._0_4_;
  fStack_be8 = fVar291 * auVar18._8_4_;
  fStack_be4 = fVar291 * auVar18._12_4_;
  auVar338._0_4_ = fVar291 * auVar150._0_4_;
  auVar338._4_4_ = fVar291 * auVar150._4_4_;
  auVar338._8_4_ = fVar291 * auVar150._8_4_;
  auVar338._12_4_ = fVar291 * auVar150._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar27);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 6)));
  auVar150 = vshufps_avx(auVar338,auVar338,0x55);
  auVar27 = vshufps_avx(auVar338,auVar338,0xaa);
  fVar108 = auVar27._0_4_;
  fVar133 = auVar27._4_4_;
  fVar135 = auVar27._8_4_;
  fVar137 = auVar27._12_4_;
  fVar300 = auVar150._0_4_;
  fVar346 = auVar150._4_4_;
  fVar302 = auVar150._8_4_;
  fVar347 = auVar150._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar26);
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar113 = vcvtdq2ps_avx(auVar18);
  auVar18 = vshufps_avx(auVar338,auVar338,0);
  fVar291 = auVar18._0_4_;
  fVar337 = auVar18._4_4_;
  fVar298 = auVar18._8_4_;
  fVar345 = auVar18._12_4_;
  auVar362._0_4_ = auVar17._0_4_ * fVar291 + fVar300 * auVar16._0_4_ + fVar108 * auVar28._0_4_;
  auVar362._4_4_ = auVar17._4_4_ * fVar337 + fVar346 * auVar16._4_4_ + fVar133 * auVar28._4_4_;
  auVar362._8_4_ = auVar17._8_4_ * fVar298 + fVar302 * auVar16._8_4_ + fVar135 * auVar28._8_4_;
  auVar362._12_4_ = auVar17._12_4_ * fVar345 + fVar347 * auVar16._12_4_ + fVar137 * auVar28._12_4_;
  auVar339._0_4_ = auVar237._0_4_ * fVar291 + fVar108 * auVar30._0_4_ + fVar300 * auVar29._0_4_;
  auVar339._4_4_ = auVar237._4_4_ * fVar337 + fVar133 * auVar30._4_4_ + fVar346 * auVar29._4_4_;
  auVar339._8_4_ = auVar237._8_4_ * fVar298 + fVar135 * auVar30._8_4_ + fVar302 * auVar29._8_4_;
  auVar339._12_4_ = auVar237._12_4_ * fVar345 + fVar137 * auVar30._12_4_ + fVar347 * auVar29._12_4_;
  local_be0._4_4_ = fVar346 * auVar179._4_4_ + fVar133 * auVar113._4_4_ + fVar337 * auVar189._4_4_;
  local_be0._0_4_ = fVar300 * auVar179._0_4_ + fVar108 * auVar113._0_4_ + fVar291 * auVar189._0_4_;
  fStack_bd8 = fVar302 * auVar179._8_4_ + fVar135 * auVar113._8_4_ + fVar298 * auVar189._8_4_;
  fStack_bd4 = fVar347 * auVar179._12_4_ + fVar137 * auVar113._12_4_ + fVar345 * auVar189._12_4_;
  auVar18 = vshufps_avx(_local_bf0,_local_bf0,0x55);
  auVar150 = vshufps_avx(_local_bf0,_local_bf0,0xaa);
  fVar108 = auVar150._0_4_;
  fVar133 = auVar150._4_4_;
  fVar135 = auVar150._8_4_;
  fVar137 = auVar150._12_4_;
  fVar291 = auVar18._0_4_;
  fVar298 = auVar18._4_4_;
  fVar300 = auVar18._8_4_;
  fVar302 = auVar18._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar109 = vpmovsxwd_avx(auVar18);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar112 = vpmovsxwd_avx(auVar150);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar148 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 6);
  auVar27 = vpmovsxwd_avx(auVar27);
  auVar18 = vpermilps_avx(_local_bf0,0);
  fVar337 = auVar18._0_4_;
  fVar345 = auVar18._4_4_;
  fVar346 = auVar18._8_4_;
  fVar347 = auVar18._12_4_;
  auVar351._0_4_ = auVar16._0_4_ * fVar291 + fVar108 * auVar28._0_4_ + auVar17._0_4_ * fVar337;
  auVar351._4_4_ = auVar16._4_4_ * fVar298 + fVar133 * auVar28._4_4_ + auVar17._4_4_ * fVar345;
  auVar351._8_4_ = auVar16._8_4_ * fVar300 + fVar135 * auVar28._8_4_ + auVar17._8_4_ * fVar346;
  auVar351._12_4_ = auVar16._12_4_ * fVar302 + fVar137 * auVar28._12_4_ + auVar17._12_4_ * fVar347;
  auVar310._0_4_ = auVar30._0_4_ * fVar108 + fVar291 * auVar29._0_4_ + auVar237._0_4_ * fVar337;
  auVar310._4_4_ = auVar30._4_4_ * fVar133 + fVar298 * auVar29._4_4_ + auVar237._4_4_ * fVar345;
  auVar310._8_4_ = auVar30._8_4_ * fVar135 + fVar300 * auVar29._8_4_ + auVar237._8_4_ * fVar346;
  auVar310._12_4_ = auVar30._12_4_ * fVar137 + fVar302 * auVar29._12_4_ + auVar237._12_4_ * fVar347;
  auVar219._0_4_ = fVar337 * auVar189._0_4_ + fVar291 * auVar179._0_4_ + fVar108 * auVar113._0_4_;
  auVar219._4_4_ = fVar345 * auVar189._4_4_ + fVar298 * auVar179._4_4_ + fVar133 * auVar113._4_4_;
  auVar219._8_4_ = fVar346 * auVar189._8_4_ + fVar300 * auVar179._8_4_ + fVar135 * auVar113._8_4_;
  auVar219._12_4_ =
       fVar347 * auVar189._12_4_ + fVar302 * auVar179._12_4_ + fVar137 * auVar113._12_4_;
  auVar375._8_4_ = 0x7fffffff;
  auVar375._0_8_ = 0x7fffffff7fffffff;
  auVar375._12_4_ = 0x7fffffff;
  auVar18 = vandps_avx(auVar362,auVar375);
  auVar263._8_4_ = 0x219392ef;
  auVar263._0_8_ = 0x219392ef219392ef;
  auVar263._12_4_ = 0x219392ef;
  auVar18 = vcmpps_avx(auVar18,auVar263,1);
  auVar150 = vblendvps_avx(auVar362,auVar263,auVar18);
  auVar18 = vandps_avx(auVar339,auVar375);
  auVar18 = vcmpps_avx(auVar18,auVar263,1);
  auVar26 = vblendvps_avx(auVar339,auVar263,auVar18);
  auVar18 = vandps_avx(auVar375,_local_be0);
  auVar18 = vcmpps_avx(auVar18,auVar263,1);
  auVar18 = vblendvps_avx(_local_be0,auVar263,auVar18);
  auVar16 = vrcpps_avx(auVar150);
  fVar261 = auVar16._0_4_;
  auVar147._0_4_ = fVar261 * auVar150._0_4_;
  fVar270 = auVar16._4_4_;
  auVar147._4_4_ = fVar270 * auVar150._4_4_;
  fVar274 = auVar16._8_4_;
  auVar147._8_4_ = fVar274 * auVar150._8_4_;
  fVar278 = auVar16._12_4_;
  auVar147._12_4_ = fVar278 * auVar150._12_4_;
  auVar340._8_4_ = 0x3f800000;
  auVar340._0_8_ = 0x3f8000003f800000;
  auVar340._12_4_ = 0x3f800000;
  auVar150 = vsubps_avx(auVar340,auVar147);
  fVar261 = fVar261 + fVar261 * auVar150._0_4_;
  fVar270 = fVar270 + fVar270 * auVar150._4_4_;
  fVar274 = fVar274 + fVar274 * auVar150._8_4_;
  fVar278 = fVar278 + fVar278 * auVar150._12_4_;
  auVar150 = vrcpps_avx(auVar26);
  fVar291 = auVar150._0_4_;
  auVar293._0_4_ = fVar291 * auVar26._0_4_;
  fVar298 = auVar150._4_4_;
  auVar293._4_4_ = fVar298 * auVar26._4_4_;
  fVar300 = auVar150._8_4_;
  auVar293._8_4_ = fVar300 * auVar26._8_4_;
  fVar302 = auVar150._12_4_;
  auVar293._12_4_ = fVar302 * auVar26._12_4_;
  auVar150 = vsubps_avx(auVar340,auVar293);
  fVar291 = fVar291 + fVar291 * auVar150._0_4_;
  fVar298 = fVar298 + fVar298 * auVar150._4_4_;
  fVar300 = fVar300 + fVar300 * auVar150._8_4_;
  fVar302 = fVar302 + fVar302 * auVar150._12_4_;
  auVar150 = vrcpps_avx(auVar18);
  fVar337 = auVar150._0_4_;
  auVar174._0_4_ = fVar337 * auVar18._0_4_;
  fVar345 = auVar150._4_4_;
  auVar174._4_4_ = fVar345 * auVar18._4_4_;
  fVar346 = auVar150._8_4_;
  auVar174._8_4_ = fVar346 * auVar18._8_4_;
  fVar347 = auVar150._12_4_;
  auVar174._12_4_ = fVar347 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar340,auVar174);
  fVar337 = fVar337 + fVar337 * auVar18._0_4_;
  fVar345 = fVar345 + fVar345 * auVar18._4_4_;
  fVar346 = fVar346 + fVar346 * auVar18._8_4_;
  fVar347 = fVar347 + fVar347 * auVar18._12_4_;
  auVar26 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar102 + 0x16)) *
                                        *(float *)(prim + lVar102 + 0x1a))),0);
  auVar18 = vcvtdq2ps_avx(auVar109);
  auVar150 = vcvtdq2ps_avx(auVar112);
  auVar150 = vsubps_avx(auVar150,auVar18);
  fVar108 = auVar26._0_4_;
  fVar133 = auVar26._4_4_;
  fVar135 = auVar26._8_4_;
  fVar137 = auVar26._12_4_;
  auVar153._0_4_ = fVar108 * auVar150._0_4_ + auVar18._0_4_;
  auVar153._4_4_ = fVar133 * auVar150._4_4_ + auVar18._4_4_;
  auVar153._8_4_ = fVar135 * auVar150._8_4_ + auVar18._8_4_;
  auVar153._12_4_ = fVar137 * auVar150._12_4_ + auVar18._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar148);
  auVar150 = vcvtdq2ps_avx(auVar27);
  auVar150 = vsubps_avx(auVar150,auVar18);
  auVar113._0_4_ = fVar108 * auVar150._0_4_ + auVar18._0_4_;
  auVar113._4_4_ = fVar133 * auVar150._4_4_ + auVar18._4_4_;
  auVar113._8_4_ = fVar135 * auVar150._8_4_ + auVar18._8_4_;
  auVar113._12_4_ = fVar137 * auVar150._12_4_ + auVar18._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 6);
  auVar18 = vpmovsxwd_avx(auVar16);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar97 * 0x16 + 6);
  auVar150 = vpmovsxwd_avx(auVar28);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar18);
  auVar202._0_4_ = fVar108 * auVar150._0_4_ + auVar18._0_4_;
  auVar202._4_4_ = fVar133 * auVar150._4_4_ + auVar18._4_4_;
  auVar202._8_4_ = fVar135 * auVar150._8_4_ + auVar18._8_4_;
  auVar202._12_4_ = fVar137 * auVar150._12_4_ + auVar18._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar97 * 0x14 + 6);
  auVar18 = vpmovsxwd_avx(auVar29);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 6);
  auVar150 = vpmovsxwd_avx(auVar30);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar26 = vsubps_avx(auVar150,auVar18);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 6);
  auVar150 = vpmovsxwd_avx(auVar17);
  auVar234._0_4_ = auVar26._0_4_ * fVar108 + auVar18._0_4_;
  auVar234._4_4_ = auVar26._4_4_ * fVar133 + auVar18._4_4_;
  auVar234._8_4_ = auVar26._8_4_ * fVar135 + auVar18._8_4_;
  auVar234._12_4_ = auVar26._12_4_ * fVar137 + auVar18._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar150);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar97 * 0x21 + 6);
  auVar150 = vpmovsxwd_avx(auVar237);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar18);
  auVar363._0_4_ = auVar150._0_4_ * fVar108 + auVar18._0_4_;
  auVar363._4_4_ = auVar150._4_4_ * fVar133 + auVar18._4_4_;
  auVar363._8_4_ = auVar150._8_4_ * fVar135 + auVar18._8_4_;
  auVar363._12_4_ = auVar150._12_4_ * fVar137 + auVar18._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar97 * 0x1f + 6);
  auVar18 = vpmovsxwd_avx(auVar189);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 6);
  auVar150 = vpmovsxwd_avx(auVar179);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar18);
  auVar175._0_4_ = auVar18._0_4_ + auVar150._0_4_ * fVar108;
  auVar175._4_4_ = auVar18._4_4_ + auVar150._4_4_ * fVar133;
  auVar175._8_4_ = auVar18._8_4_ + auVar150._8_4_ * fVar135;
  auVar175._12_4_ = auVar18._12_4_ + auVar150._12_4_ * fVar137;
  auVar18 = vsubps_avx(auVar153,auVar351);
  auVar148._0_4_ = fVar261 * auVar18._0_4_;
  auVar148._4_4_ = fVar270 * auVar18._4_4_;
  auVar148._8_4_ = fVar274 * auVar18._8_4_;
  auVar148._12_4_ = fVar278 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar113,auVar351);
  auVar109._0_4_ = fVar261 * auVar18._0_4_;
  auVar109._4_4_ = fVar270 * auVar18._4_4_;
  auVar109._8_4_ = fVar274 * auVar18._8_4_;
  auVar109._12_4_ = fVar278 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar202,auVar310);
  auVar203._0_4_ = fVar291 * auVar18._0_4_;
  auVar203._4_4_ = fVar298 * auVar18._4_4_;
  auVar203._8_4_ = fVar300 * auVar18._8_4_;
  auVar203._12_4_ = fVar302 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar234,auVar310);
  auVar235._0_4_ = fVar291 * auVar18._0_4_;
  auVar235._4_4_ = fVar298 * auVar18._4_4_;
  auVar235._8_4_ = fVar300 * auVar18._8_4_;
  auVar235._12_4_ = fVar302 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar363,auVar219);
  auVar264._0_4_ = fVar337 * auVar18._0_4_;
  auVar264._4_4_ = fVar345 * auVar18._4_4_;
  auVar264._8_4_ = fVar346 * auVar18._8_4_;
  auVar264._12_4_ = fVar347 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar175,auVar219);
  auVar176._0_4_ = fVar337 * auVar18._0_4_;
  auVar176._4_4_ = fVar345 * auVar18._4_4_;
  auVar176._8_4_ = fVar346 * auVar18._8_4_;
  auVar176._12_4_ = fVar347 * auVar18._12_4_;
  auVar18 = vpminsd_avx(auVar148,auVar109);
  auVar150 = vpminsd_avx(auVar203,auVar235);
  auVar18 = vmaxps_avx(auVar18,auVar150);
  auVar150 = vpminsd_avx(auVar264,auVar176);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar311._4_4_ = uVar8;
  auVar311._0_4_ = uVar8;
  auVar311._8_4_ = uVar8;
  auVar311._12_4_ = uVar8;
  auVar150 = vmaxps_avx(auVar150,auVar311);
  auVar18 = vmaxps_avx(auVar18,auVar150);
  local_6a0._0_4_ = auVar18._0_4_ * 0.99999964;
  local_6a0._4_4_ = auVar18._4_4_ * 0.99999964;
  local_6a0._8_4_ = auVar18._8_4_ * 0.99999964;
  local_6a0._12_4_ = auVar18._12_4_ * 0.99999964;
  auVar18 = vpmaxsd_avx(auVar148,auVar109);
  auVar150 = vpmaxsd_avx(auVar203,auVar235);
  auVar18 = vminps_avx(auVar18,auVar150);
  auVar150 = vpmaxsd_avx(auVar264,auVar176);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar177._4_4_ = uVar8;
  auVar177._0_4_ = uVar8;
  auVar177._8_4_ = uVar8;
  auVar177._12_4_ = uVar8;
  auVar150 = vminps_avx(auVar150,auVar177);
  auVar18 = vminps_avx(auVar18,auVar150);
  auVar112._0_4_ = auVar18._0_4_ * 1.0000004;
  auVar112._4_4_ = auVar18._4_4_ * 1.0000004;
  auVar112._8_4_ = auVar18._8_4_ * 1.0000004;
  auVar112._12_4_ = auVar18._12_4_ * 1.0000004;
  auVar18 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar150 = vpcmpgtd_avx(auVar18,_DAT_01f4ad30);
  auVar18 = vcmpps_avx(local_6a0,auVar112,2);
  auVar18 = vandps_avx(auVar18,auVar150);
  uVar101 = vmovmskps_avx(auVar18);
  auVar122._16_16_ = mm_lookupmask_ps._240_16_;
  auVar122._0_16_ = mm_lookupmask_ps._240_16_;
  local_600 = vblendps_avx(auVar122,ZEXT832(0) << 0x20,0x80);
  auVar344 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_930 = prim;
LAB_008ca772:
  local_928 = (ulong)uVar101;
  if (local_928 == 0) {
LAB_008cd31e:
    return local_928 != 0;
  }
  lVar102 = 0;
  if (local_928 != 0) {
    for (; (uVar101 >> lVar102 & 1) == 0; lVar102 = lVar102 + 1) {
    }
  }
  uVar101 = *(uint *)(local_930 + 2);
  pGVar10 = (context->scene->geometries).items[uVar101].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(local_930 + lVar102 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar291 = (pGVar10->time_range).lower;
  fVar291 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar291) / ((pGVar10->time_range).upper - fVar291));
  auVar18 = vroundss_avx(ZEXT416((uint)fVar291),ZEXT416((uint)fVar291),9);
  auVar18 = vminss_avx(auVar18,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar18 = vmaxss_avx(ZEXT816(0) << 0x20,auVar18);
  fVar291 = fVar291 - auVar18._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar103 = (long)(int)auVar18._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + 0x10 + lVar103);
  lVar13 = *(long *)(_Var11 + 0x38 + lVar103);
  lVar14 = *(long *)(_Var11 + 0x48 + lVar103);
  auVar18 = vshufps_avx(ZEXT416((uint)fVar291),ZEXT416((uint)fVar291),0);
  pfVar1 = (float *)(lVar13 + uVar97 * lVar14);
  fVar346 = auVar18._0_4_;
  fVar302 = auVar18._4_4_;
  fVar347 = auVar18._8_4_;
  fVar108 = auVar18._12_4_;
  pfVar2 = (float *)(lVar13 + (uVar97 + 1) * lVar14);
  pfVar3 = (float *)(lVar13 + (uVar97 + 2) * lVar14);
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar97 + 3));
  lVar13 = *(long *)(_Var11 + lVar103);
  auVar18 = vshufps_avx(ZEXT416((uint)(1.0 - fVar291)),ZEXT416((uint)(1.0 - fVar291)),0);
  pfVar5 = (float *)(lVar13 + lVar12 * uVar97);
  fVar337 = auVar18._0_4_;
  fVar298 = auVar18._4_4_;
  fVar345 = auVar18._8_4_;
  fVar300 = auVar18._12_4_;
  pfVar6 = (float *)(lVar13 + lVar12 * (uVar97 + 1));
  pfVar7 = (float *)(lVar13 + lVar12 * (uVar97 + 2));
  auVar178._0_4_ = fVar346 * *pfVar1 + fVar337 * *pfVar5;
  auVar178._4_4_ = fVar302 * pfVar1[1] + fVar298 * pfVar5[1];
  auVar178._8_4_ = fVar347 * pfVar1[2] + fVar345 * pfVar5[2];
  auVar178._12_4_ = fVar108 * pfVar1[3] + fVar300 * pfVar5[3];
  auVar149._0_4_ = fVar337 * *pfVar6 + fVar346 * *pfVar2;
  auVar149._4_4_ = fVar298 * pfVar6[1] + fVar302 * pfVar2[1];
  auVar149._8_4_ = fVar345 * pfVar6[2] + fVar347 * pfVar2[2];
  auVar149._12_4_ = fVar300 * pfVar6[3] + fVar108 * pfVar2[3];
  pfVar1 = (float *)(lVar13 + lVar12 * (uVar97 + 3));
  auVar204._0_4_ = fVar337 * *pfVar7 + fVar346 * *pfVar3;
  auVar204._4_4_ = fVar298 * pfVar7[1] + fVar302 * pfVar3[1];
  auVar204._8_4_ = fVar345 * pfVar7[2] + fVar347 * pfVar3[2];
  auVar204._12_4_ = fVar300 * pfVar7[3] + fVar108 * pfVar3[3];
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar150 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar291 = *(float *)(ray + k * 4 + 0x40);
  auVar376._4_4_ = fVar291;
  auVar376._0_4_ = fVar291;
  auVar376._8_4_ = fVar291;
  auVar376._12_4_ = fVar291;
  fStack_910 = fVar291;
  _local_920 = auVar376;
  fStack_90c = fVar291;
  fStack_908 = fVar291;
  fStack_904 = fVar291;
  auVar378 = ZEXT3264(_local_920);
  auVar236._0_4_ = fVar337 * *pfVar1 + fVar346 * *pfVar4;
  auVar236._4_4_ = fVar298 * pfVar1[1] + fVar302 * pfVar4[1];
  auVar236._8_4_ = fVar345 * pfVar1[2] + fVar347 * pfVar4[2];
  auVar236._12_4_ = fVar300 * pfVar1[3] + fVar108 * pfVar4[3];
  fVar337 = *(float *)(ray + k * 4 + 0x50);
  auVar387._4_4_ = fVar337;
  auVar387._0_4_ = fVar337;
  auVar387._8_4_ = fVar337;
  auVar387._12_4_ = fVar337;
  fStack_750 = fVar337;
  _local_760 = auVar387;
  fStack_74c = fVar337;
  fStack_748 = fVar337;
  fStack_744 = fVar337;
  auVar18 = vunpcklps_avx(auVar376,auVar387);
  fVar298 = *(float *)(ray + k * 4 + 0x60);
  auVar401._4_4_ = fVar298;
  auVar401._0_4_ = fVar298;
  auVar401._8_4_ = fVar298;
  auVar401._12_4_ = fVar298;
  fStack_770 = fVar298;
  _local_780 = auVar401;
  fStack_76c = fVar298;
  fStack_768 = fVar298;
  fStack_764 = fVar298;
  auVar26 = vinsertps_avx(auVar18,auVar401,0x28);
  auVar353 = ZEXT1664(auVar26);
  auVar110._0_4_ = (auVar178._0_4_ + auVar149._0_4_ + auVar204._0_4_ + auVar236._0_4_) * 0.25;
  auVar110._4_4_ = (auVar178._4_4_ + auVar149._4_4_ + auVar204._4_4_ + auVar236._4_4_) * 0.25;
  auVar110._8_4_ = (auVar178._8_4_ + auVar149._8_4_ + auVar204._8_4_ + auVar236._8_4_) * 0.25;
  auVar110._12_4_ = (auVar178._12_4_ + auVar149._12_4_ + auVar204._12_4_ + auVar236._12_4_) * 0.25;
  auVar18 = vsubps_avx(auVar110,auVar150);
  auVar18 = vdpps_avx(auVar18,auVar26,0x7f);
  local_9d0 = vdpps_avx(auVar26,auVar26,0x7f);
  auVar366 = ZEXT1664(local_9d0);
  auVar27 = vrcpss_avx(local_9d0,local_9d0);
  fVar347 = auVar18._0_4_ * auVar27._0_4_ * (2.0 - local_9d0._0_4_ * auVar27._0_4_);
  auVar297 = ZEXT464((uint)fVar347);
  auVar27 = vshufps_avx(ZEXT416((uint)fVar347),ZEXT416((uint)fVar347),0);
  fVar345 = auVar27._0_4_;
  fVar108 = auVar26._0_4_;
  fVar300 = auVar27._4_4_;
  fVar133 = auVar26._4_4_;
  fVar346 = auVar27._8_4_;
  fVar135 = auVar26._8_4_;
  fVar302 = auVar27._12_4_;
  fVar137 = auVar26._12_4_;
  auVar220._0_4_ = auVar150._0_4_ + fVar108 * fVar345;
  auVar220._4_4_ = auVar150._4_4_ + fVar133 * fVar300;
  auVar220._8_4_ = auVar150._8_4_ + fVar135 * fVar346;
  auVar220._12_4_ = auVar150._12_4_ + fVar137 * fVar302;
  auVar18 = vblendps_avx(auVar220,_DAT_01f45a50,8);
  auVar28 = vsubps_avx(auVar178,auVar18);
  auVar269 = ZEXT1664(auVar28);
  auVar29 = vsubps_avx(auVar204,auVar18);
  auVar30 = vsubps_avx(auVar149,auVar18);
  auVar17 = vsubps_avx(auVar236,auVar18);
  auVar18 = vshufps_avx(auVar28,auVar28,0);
  auVar150 = vshufps_avx(auVar28,auVar28,0x55);
  register0x00001250 = auVar150;
  _local_1e0 = auVar150;
  auVar150 = vshufps_avx(auVar28,auVar28,0xaa);
  register0x00001250 = auVar150;
  _local_200 = auVar150;
  auVar150 = vshufps_avx(auVar28,auVar28,0xff);
  register0x00001290 = auVar150;
  _local_220 = auVar150;
  auVar150 = vshufps_avx(auVar30,auVar30,0);
  register0x00001290 = auVar150;
  _local_240 = auVar150;
  auVar150 = vshufps_avx(auVar30,auVar30,0x55);
  register0x00001290 = auVar150;
  _local_260 = auVar150;
  auVar150 = vshufps_avx(auVar30,auVar30,0xaa);
  register0x00001290 = auVar150;
  _local_280 = auVar150;
  auVar150 = vshufps_avx(auVar30,auVar30,0xff);
  register0x00001290 = auVar150;
  _local_4e0 = auVar150;
  auVar150 = vshufps_avx(auVar29,auVar29,0);
  register0x00001290 = auVar150;
  _local_500 = auVar150;
  auVar150 = vshufps_avx(auVar29,auVar29,0x55);
  register0x00001290 = auVar150;
  _local_520 = auVar150;
  auVar150 = vshufps_avx(auVar29,auVar29,0xaa);
  register0x00001290 = auVar150;
  _local_540 = auVar150;
  auVar150 = vshufps_avx(auVar29,auVar29,0xff);
  register0x00001290 = auVar150;
  _local_560 = auVar150;
  auVar150 = vshufps_avx(auVar17,auVar17,0);
  register0x00001290 = auVar150;
  _local_580 = auVar150;
  auVar150 = vshufps_avx(auVar17,auVar17,0x55);
  register0x00001290 = auVar150;
  _local_5a0 = auVar150;
  auVar150 = vshufps_avx(auVar17,auVar17,0xaa);
  register0x00001290 = auVar150;
  _local_5c0 = auVar150;
  auVar150 = vshufps_avx(auVar17,auVar17,0xff);
  register0x00001290 = auVar150;
  _local_5e0 = auVar150;
  auVar150 = ZEXT416((uint)(fVar291 * fVar291 + fVar337 * fVar337 + fVar298 * fVar298));
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  local_2a0._16_16_ = auVar150;
  local_2a0._0_16_ = auVar150;
  fVar291 = *(float *)(ray + k * 4 + 0x30);
  local_950 = ZEXT416((uint)fVar347);
  auVar150 = vshufps_avx(ZEXT416((uint)(fVar291 - fVar347)),ZEXT416((uint)(fVar291 - fVar347)),0);
  local_340._16_16_ = auVar150;
  local_340._0_16_ = auVar150;
  local_850 = vpshufd_avx(ZEXT416(uVar101),0);
  local_860 = vpshufd_avx(ZEXT416(*(uint *)(local_930 + lVar102 * 4 + 6)),0);
  uVar97 = 0;
  bVar100 = 0;
  local_c88 = 1;
  local_640 = vandps_avx(auVar344._0_32_,local_2a0);
  auVar150 = vsqrtss_avx(local_9d0,local_9d0);
  auVar16 = vsqrtss_avx(local_9d0,local_9d0);
  local_690 = ZEXT816(0x3f80000000000000);
  do {
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = 0x3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    auVar237 = vmovshdup_avx(local_690);
    auVar179 = vsubps_avx(auVar237,local_690);
    auVar237 = vshufps_avx(local_690,local_690,0);
    auVar189 = vshufps_avx(auVar179,auVar179,0);
    fVar146 = auVar189._0_4_;
    fVar170 = auVar189._4_4_;
    fVar171 = auVar189._8_4_;
    fVar172 = auVar189._12_4_;
    fVar173 = auVar237._0_4_;
    auVar215._0_4_ = fVar173 + fVar146 * 0.0;
    fVar199 = auVar237._4_4_;
    auVar215._4_4_ = fVar199 + fVar170 * 0.14285715;
    fVar200 = auVar237._8_4_;
    auVar215._8_4_ = fVar200 + fVar171 * 0.2857143;
    fVar201 = auVar237._12_4_;
    auVar215._12_4_ = fVar201 + fVar172 * 0.42857146;
    auVar215._16_4_ = fVar173 + fVar146 * 0.5714286;
    auVar215._20_4_ = fVar199 + fVar170 * 0.71428573;
    auVar215._24_4_ = fVar200 + fVar171 * 0.8571429;
    auVar215._28_4_ = fVar201 + fVar172;
    auVar122 = vsubps_avx(auVar243,auVar215);
    fVar337 = auVar122._0_4_;
    fVar298 = auVar122._4_4_;
    fVar347 = auVar122._8_4_;
    fVar261 = auVar122._12_4_;
    fVar270 = auVar122._16_4_;
    fVar274 = auVar122._20_4_;
    fVar278 = auVar122._24_4_;
    fVar262 = fVar337 * fVar337 * fVar337;
    fVar271 = fVar298 * fVar298 * fVar298;
    fVar275 = fVar347 * fVar347 * fVar347;
    fVar279 = fVar261 * fVar261 * fVar261;
    fVar282 = fVar270 * fVar270 * fVar270;
    fVar285 = fVar274 * fVar274 * fVar274;
    fVar288 = fVar278 * fVar278 * fVar278;
    fVar292 = auVar215._0_4_ * auVar215._0_4_ * auVar215._0_4_;
    fVar299 = auVar215._4_4_ * auVar215._4_4_ * auVar215._4_4_;
    fVar301 = auVar215._8_4_ * auVar215._8_4_ * auVar215._8_4_;
    fVar303 = auVar215._12_4_ * auVar215._12_4_ * auVar215._12_4_;
    fVar304 = auVar215._16_4_ * auVar215._16_4_ * auVar215._16_4_;
    fVar305 = auVar215._20_4_ * auVar215._20_4_ * auVar215._20_4_;
    fVar306 = auVar215._24_4_ * auVar215._24_4_ * auVar215._24_4_;
    fVar233 = auVar215._0_4_ * fVar337;
    fVar252 = auVar215._4_4_ * fVar298;
    fVar253 = auVar215._8_4_ * fVar347;
    fVar254 = auVar215._12_4_ * fVar261;
    fVar255 = auVar215._16_4_ * fVar270;
    fVar256 = auVar215._20_4_ * fVar274;
    fVar258 = auVar215._24_4_ * fVar278;
    fVar360 = auVar353._28_4_ + auVar378._28_4_;
    fVar334 = auVar297._28_4_ + 1.0 + fVar360;
    fVar348 = fVar360 + auVar269._28_4_ + auVar366._28_4_ + auVar344._28_4_;
    fVar360 = fVar262 * 0.16666667;
    fVar272 = fVar271 * 0.16666667;
    fVar276 = fVar275 * 0.16666667;
    fVar280 = fVar279 * 0.16666667;
    fVar283 = fVar282 * 0.16666667;
    fVar286 = fVar285 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar307 = (fVar292 + fVar262 * 4.0 + fVar337 * fVar233 * 12.0 + auVar215._0_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar316 = (fVar299 + fVar271 * 4.0 + fVar298 * fVar252 * 12.0 + auVar215._4_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar319 = (fVar301 + fVar275 * 4.0 + fVar347 * fVar253 * 12.0 + auVar215._8_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar322 = (fVar303 + fVar279 * 4.0 + fVar261 * fVar254 * 12.0 + auVar215._12_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar325 = (fVar304 + fVar282 * 4.0 + fVar270 * fVar255 * 12.0 + auVar215._16_4_ * fVar255 * 6.0)
              * 0.16666667;
    fVar328 = (fVar305 + fVar285 * 4.0 + fVar274 * fVar256 * 12.0 + auVar215._20_4_ * fVar256 * 6.0)
              * 0.16666667;
    fVar331 = (fVar306 + fVar288 * 4.0 + fVar278 * fVar258 * 12.0 + auVar215._24_4_ * fVar258 * 6.0)
              * 0.16666667;
    fVar262 = (fVar292 * 4.0 + fVar262 + auVar215._0_4_ * fVar233 * 12.0 + fVar337 * fVar233 * 6.0)
              * 0.16666667;
    fVar271 = (fVar299 * 4.0 + fVar271 + auVar215._4_4_ * fVar252 * 12.0 + fVar298 * fVar252 * 6.0)
              * 0.16666667;
    fVar275 = (fVar301 * 4.0 + fVar275 + auVar215._8_4_ * fVar253 * 12.0 + fVar347 * fVar253 * 6.0)
              * 0.16666667;
    fVar279 = (fVar303 * 4.0 + fVar279 + auVar215._12_4_ * fVar254 * 12.0 + fVar261 * fVar254 * 6.0)
              * 0.16666667;
    fVar282 = (fVar304 * 4.0 + fVar282 + auVar215._16_4_ * fVar255 * 12.0 + fVar270 * fVar255 * 6.0)
              * 0.16666667;
    fVar285 = (fVar305 * 4.0 + fVar285 + auVar215._20_4_ * fVar256 * 12.0 + fVar274 * fVar256 * 6.0)
              * 0.16666667;
    fVar288 = (fVar306 * 4.0 + fVar288 + auVar215._24_4_ * fVar258 * 12.0 + fVar278 * fVar258 * 6.0)
              * 0.16666667;
    fVar292 = fVar292 * 0.16666667;
    fVar299 = fVar299 * 0.16666667;
    fVar301 = fVar301 * 0.16666667;
    fVar303 = fVar303 * 0.16666667;
    fVar304 = fVar304 * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar373 = auVar366._28_4_ + 12.0;
    fVar349 = fVar348 + 12.166667;
    fVar404 = auVar18._0_4_;
    fVar406 = auVar18._4_4_;
    fVar257 = auVar18._8_4_;
    fVar407 = auVar18._12_4_;
    local_9a0 = fVar404 * fVar360 +
                (float)local_240._0_4_ * fVar307 +
                fVar292 * (float)local_580._0_4_ + fVar262 * (float)local_500._0_4_;
    fStack_99c = fVar406 * fVar272 +
                 (float)local_240._4_4_ * fVar316 +
                 fVar299 * (float)local_580._4_4_ + fVar271 * (float)local_500._4_4_;
    fStack_998 = fVar257 * fVar276 +
                 fStack_238 * fVar319 + fVar301 * fStack_578 + fVar275 * fStack_4f8;
    fStack_994 = fVar407 * fVar280 +
                 fStack_234 * fVar322 + fVar303 * fStack_574 + fVar279 * fStack_4f4;
    fStack_990 = fVar404 * fVar283 +
                 fStack_230 * fVar325 + fVar304 * fStack_570 + fVar282 * fStack_4f0;
    fStack_98c = fVar406 * fVar286 +
                 fStack_22c * fVar328 + fVar305 * fStack_56c + fVar285 * fStack_4ec;
    fStack_988 = fVar257 * fVar289 +
                 fStack_228 * fVar331 + fVar306 * fStack_568 + fVar288 * fStack_4e8;
    fStack_984 = fVar334 + fVar349;
    fVar308 = (float)local_1e0._0_4_ * fVar360 +
              fVar307 * (float)local_260._0_4_ +
              fVar292 * (float)local_5a0._0_4_ + fVar262 * (float)local_520._0_4_;
    fVar317 = (float)local_1e0._4_4_ * fVar272 +
              fVar316 * (float)local_260._4_4_ +
              fVar299 * (float)local_5a0._4_4_ + fVar271 * (float)local_520._4_4_;
    fVar320 = fStack_1d8 * fVar276 +
              fVar319 * fStack_258 + fVar301 * fStack_598 + fVar275 * fStack_518;
    fVar323 = fStack_1d4 * fVar280 +
              fVar322 * fStack_254 + fVar303 * fStack_594 + fVar279 * fStack_514;
    fVar326 = fStack_1d0 * fVar283 +
              fVar325 * fStack_250 + fVar304 * fStack_590 + fVar282 * fStack_510;
    fVar329 = fStack_1cc * fVar286 +
              fVar328 * fStack_24c + fVar305 * fStack_58c + fVar285 * fStack_50c;
    fVar332 = fStack_1c8 * fVar289 +
              fVar331 * fStack_248 + fVar306 * fStack_588 + fVar288 * fStack_508;
    fVar335 = fStack_984 + fVar373 + 12.166667;
    fVar309 = (float)local_200._0_4_ * fVar360 +
              (float)local_280._0_4_ * fVar307 +
              fVar292 * (float)local_5c0._0_4_ + fVar262 * (float)local_540._0_4_;
    fVar318 = (float)local_200._4_4_ * fVar272 +
              (float)local_280._4_4_ * fVar316 +
              fVar299 * (float)local_5c0._4_4_ + fVar271 * (float)local_540._4_4_;
    fVar321 = fStack_1f8 * fVar276 +
              fStack_278 * fVar319 + fVar301 * fStack_5b8 + fVar275 * fStack_538;
    fVar324 = fStack_1f4 * fVar280 +
              fStack_274 * fVar322 + fVar303 * fStack_5b4 + fVar279 * fStack_534;
    fVar327 = fStack_1f0 * fVar283 +
              fStack_270 * fVar325 + fVar304 * fStack_5b0 + fVar282 * fStack_530;
    fVar330 = fStack_1ec * fVar286 +
              fStack_26c * fVar328 + fVar305 * fStack_5ac + fVar285 * fStack_52c;
    fVar333 = fStack_1e8 * fVar289 +
              fStack_268 * fVar331 + fVar306 * fStack_5a8 + fVar288 * fStack_528;
    fVar336 = fVar335 + fVar373 + auVar378._28_4_ + 12.0;
    local_a80._0_4_ =
         (float)local_220._0_4_ * fVar360 +
         fVar307 * (float)local_4e0._0_4_ +
         fVar262 * (float)local_560._0_4_ + fVar292 * (float)local_5e0._0_4_;
    local_a80._4_4_ =
         (float)local_220._4_4_ * fVar272 +
         fVar316 * (float)local_4e0._4_4_ +
         fVar271 * (float)local_560._4_4_ + fVar299 * (float)local_5e0._4_4_;
    fStack_a78 = fStack_218 * fVar276 +
                 fVar319 * fStack_4d8 + fVar275 * fStack_558 + fVar301 * fStack_5d8;
    fStack_a74 = fStack_214 * fVar280 +
                 fVar322 * fStack_4d4 + fVar279 * fStack_554 + fVar303 * fStack_5d4;
    fStack_a70 = fStack_210 * fVar283 +
                 fVar325 * fStack_4d0 + fVar282 * fStack_550 + fVar304 * fStack_5d0;
    fStack_a6c = fStack_20c * fVar286 +
                 fVar328 * fStack_4cc + fVar285 * fStack_54c + fVar305 * fStack_5cc;
    fStack_a68 = fStack_208 * fVar289 +
                 fVar331 * fStack_4c8 + fVar288 * fStack_548 + fVar306 * fStack_5c8;
    fStack_a64 = auVar269._28_4_ + fVar334 + fVar348 + auVar297._28_4_;
    auVar34._4_4_ = auVar215._4_4_ * -auVar215._4_4_;
    auVar34._0_4_ = auVar215._0_4_ * -auVar215._0_4_;
    auVar34._8_4_ = auVar215._8_4_ * -auVar215._8_4_;
    auVar34._12_4_ = auVar215._12_4_ * -auVar215._12_4_;
    auVar34._16_4_ = auVar215._16_4_ * -auVar215._16_4_;
    auVar34._20_4_ = auVar215._20_4_ * -auVar215._20_4_;
    auVar34._24_4_ = auVar215._24_4_ * -auVar215._24_4_;
    auVar34._28_4_ = auVar215._28_4_;
    auVar33._4_4_ = fVar252 * 4.0;
    auVar33._0_4_ = fVar233 * 4.0;
    auVar33._8_4_ = fVar253 * 4.0;
    auVar33._12_4_ = fVar254 * 4.0;
    auVar33._16_4_ = fVar255 * 4.0;
    auVar33._20_4_ = fVar256 * 4.0;
    auVar33._24_4_ = fVar258 * 4.0;
    auVar33._28_4_ = 0x3f800000;
    auVar122 = vsubps_avx(auVar34,auVar33);
    fVar283 = fVar337 * -fVar337 * 0.5;
    fVar288 = fVar298 * -fVar298 * 0.5;
    fVar289 = fVar347 * -fVar347 * 0.5;
    fVar292 = fVar261 * -fVar261 * 0.5;
    fVar299 = fVar270 * -fVar270 * 0.5;
    fVar301 = fVar274 * -fVar274 * 0.5;
    fVar303 = fVar278 * -fVar278 * 0.5;
    fVar271 = auVar122._0_4_ * 0.5;
    fVar272 = auVar122._4_4_ * 0.5;
    fVar276 = auVar122._8_4_ * 0.5;
    fVar279 = auVar122._12_4_ * 0.5;
    fVar280 = auVar122._16_4_ * 0.5;
    fVar285 = auVar122._20_4_ * 0.5;
    fVar286 = auVar122._24_4_ * 0.5;
    fVar233 = (fVar337 * fVar337 + fVar233 * 4.0) * 0.5;
    fVar262 = (fVar298 * fVar298 + fVar252 * 4.0) * 0.5;
    fVar360 = (fVar347 * fVar347 + fVar253 * 4.0) * 0.5;
    fVar254 = (fVar261 * fVar261 + fVar254 * 4.0) * 0.5;
    fVar255 = (fVar270 * fVar270 + fVar255 * 4.0) * 0.5;
    fVar275 = (fVar274 * fVar274 + fVar256 * 4.0) * 0.5;
    fVar258 = (fVar278 * fVar278 + fVar258 * 4.0) * 0.5;
    fVar337 = auVar215._0_4_ * auVar215._0_4_ * 0.5;
    fVar298 = auVar215._4_4_ * auVar215._4_4_ * 0.5;
    fVar347 = auVar215._8_4_ * auVar215._8_4_ * 0.5;
    fVar261 = auVar215._12_4_ * auVar215._12_4_ * 0.5;
    fVar270 = auVar215._16_4_ * auVar215._16_4_ * 0.5;
    fVar274 = auVar215._20_4_ * auVar215._20_4_ * 0.5;
    fVar253 = auVar215._24_4_ * auVar215._24_4_ * 0.5;
    auVar237 = vpermilps_avx(ZEXT416((uint)(auVar179._0_4_ * 0.04761905)),0);
    fVar278 = auVar237._0_4_;
    fVar374 = fVar278 * (fVar404 * fVar283 +
                        (float)local_240._0_4_ * fVar271 +
                        fVar233 * (float)local_500._0_4_ + fVar337 * (float)local_580._0_4_);
    fVar252 = auVar237._4_4_;
    fVar379 = fVar252 * (fVar406 * fVar288 +
                        (float)local_240._4_4_ * fVar272 +
                        fVar262 * (float)local_500._4_4_ + fVar298 * (float)local_580._4_4_);
    auVar41._4_4_ = fVar379;
    auVar41._0_4_ = fVar374;
    fVar256 = auVar237._8_4_;
    fVar380 = fVar256 * (fVar257 * fVar289 +
                        fStack_238 * fVar276 + fVar360 * fStack_4f8 + fVar347 * fStack_578);
    auVar41._8_4_ = fVar380;
    fVar282 = auVar237._12_4_;
    fVar381 = fVar282 * (fVar407 * fVar292 +
                        fStack_234 * fVar279 + fVar254 * fStack_4f4 + fVar261 * fStack_574);
    auVar41._12_4_ = fVar381;
    fVar382 = fVar278 * (fVar404 * fVar299 +
                        fStack_230 * fVar280 + fVar255 * fStack_4f0 + fVar270 * fStack_570);
    auVar41._16_4_ = fVar382;
    fVar383 = fVar252 * (fVar406 * fVar301 +
                        fStack_22c * fVar285 + fVar275 * fStack_4ec + fVar274 * fStack_56c);
    auVar41._20_4_ = fVar383;
    fVar384 = fVar256 * (fVar257 * fVar303 +
                        fStack_228 * fVar286 + fVar258 * fStack_4e8 + fVar253 * fStack_568);
    auVar41._24_4_ = fVar384;
    auVar41._28_4_ = uStack_1c4;
    fVar361 = fVar278 * ((float)local_1e0._0_4_ * fVar283 +
                        (float)local_260._0_4_ * fVar271 +
                        fVar233 * (float)local_520._0_4_ + fVar337 * (float)local_5a0._0_4_);
    fVar367 = fVar252 * ((float)local_1e0._4_4_ * fVar288 +
                        (float)local_260._4_4_ * fVar272 +
                        fVar262 * (float)local_520._4_4_ + fVar298 * (float)local_5a0._4_4_);
    auVar39._4_4_ = fVar367;
    auVar39._0_4_ = fVar361;
    fVar368 = fVar256 * (fStack_1d8 * fVar289 +
                        fStack_258 * fVar276 + fVar360 * fStack_518 + fVar347 * fStack_598);
    auVar39._8_4_ = fVar368;
    fVar369 = fVar282 * (fStack_1d4 * fVar292 +
                        fStack_254 * fVar279 + fVar254 * fStack_514 + fVar261 * fStack_594);
    auVar39._12_4_ = fVar369;
    fVar370 = fVar278 * (fStack_1d0 * fVar299 +
                        fStack_250 * fVar280 + fVar255 * fStack_510 + fVar270 * fStack_590);
    auVar39._16_4_ = fVar370;
    fVar371 = fVar252 * (fStack_1cc * fVar301 +
                        fStack_24c * fVar285 + fVar275 * fStack_50c + fVar274 * fStack_58c);
    auVar39._20_4_ = fVar371;
    fVar372 = fVar256 * (fStack_1c8 * fVar303 +
                        fStack_248 * fVar286 + fVar258 * fStack_508 + fVar253 * fStack_588);
    auVar39._24_4_ = fVar372;
    auVar39._28_4_ = fStack_204;
    fVar385 = fVar278 * ((float)local_200._0_4_ * fVar283 +
                        fVar337 * (float)local_5c0._0_4_ + fVar233 * (float)local_540._0_4_ +
                        (float)local_280._0_4_ * fVar271);
    fVar389 = fVar252 * ((float)local_200._4_4_ * fVar288 +
                        fVar298 * (float)local_5c0._4_4_ + fVar262 * (float)local_540._4_4_ +
                        (float)local_280._4_4_ * fVar272);
    auVar40._4_4_ = fVar389;
    auVar40._0_4_ = fVar385;
    fVar391 = fVar256 * (fStack_1f8 * fVar289 +
                        fVar347 * fStack_5b8 + fVar360 * fStack_538 + fStack_278 * fVar276);
    auVar40._8_4_ = fVar391;
    fVar393 = fVar282 * (fStack_1f4 * fVar292 +
                        fVar261 * fStack_5b4 + fVar254 * fStack_534 + fStack_274 * fVar279);
    auVar40._12_4_ = fVar393;
    fVar395 = fVar278 * (fStack_1f0 * fVar299 +
                        fVar270 * fStack_5b0 + fVar255 * fStack_530 + fStack_270 * fVar280);
    auVar40._16_4_ = fVar395;
    fVar397 = fVar252 * (fStack_1ec * fVar301 +
                        fVar274 * fStack_5ac + fVar275 * fStack_52c + fStack_26c * fVar285);
    auVar40._20_4_ = fVar397;
    fVar399 = fVar256 * (fStack_1e8 * fVar303 +
                        fVar253 * fStack_5a8 + fVar258 * fStack_528 + fStack_268 * fVar286);
    auVar40._24_4_ = fVar399;
    auVar40._28_4_ = uStack_224;
    fVar233 = fVar278 * ((float)local_220._0_4_ * fVar283 +
                        fVar271 * (float)local_4e0._0_4_ +
                        fVar337 * (float)local_5e0._0_4_ + fVar233 * (float)local_560._0_4_);
    fVar271 = fVar252 * ((float)local_220._4_4_ * fVar288 +
                        fVar272 * (float)local_4e0._4_4_ +
                        fVar298 * (float)local_5e0._4_4_ + fVar262 * (float)local_560._4_4_);
    auVar35._4_4_ = fVar271;
    auVar35._0_4_ = fVar233;
    fVar272 = fVar256 * (fStack_218 * fVar289 +
                        fVar276 * fStack_4d8 + fVar347 * fStack_5d8 + fVar360 * fStack_558);
    auVar35._8_4_ = fVar272;
    fVar283 = fVar282 * (fStack_214 * fVar292 +
                        fVar279 * fStack_4d4 + fVar261 * fStack_5d4 + fVar254 * fStack_554);
    auVar35._12_4_ = fVar283;
    fVar278 = fVar278 * (fStack_210 * fVar299 +
                        fVar280 * fStack_4d0 + fVar270 * fStack_5d0 + fVar255 * fStack_550);
    auVar35._16_4_ = fVar278;
    fVar252 = fVar252 * (fStack_20c * fVar301 +
                        fVar285 * fStack_4cc + fVar274 * fStack_5cc + fVar275 * fStack_54c);
    auVar35._20_4_ = fVar252;
    fVar256 = fVar256 * (fStack_208 * fVar303 +
                        fVar286 * fStack_4c8 + fVar253 * fStack_5c8 + fVar258 * fStack_548);
    auVar35._24_4_ = fVar256;
    auVar35._28_4_ = fVar282;
    auVar89._4_4_ = fVar317;
    auVar89._0_4_ = fVar308;
    auVar89._8_4_ = fVar320;
    auVar89._12_4_ = fVar323;
    auVar89._16_4_ = fVar326;
    auVar89._20_4_ = fVar329;
    auVar89._24_4_ = fVar332;
    auVar89._28_4_ = fVar335;
    auVar122 = vperm2f128_avx(auVar89,auVar89,1);
    auVar122 = vshufps_avx(auVar122,auVar89,0x30);
    local_a20 = vshufps_avx(auVar89,auVar122,0x29);
    auVar87._4_4_ = fVar318;
    auVar87._0_4_ = fVar309;
    auVar87._8_4_ = fVar321;
    auVar87._12_4_ = fVar324;
    auVar87._16_4_ = fVar327;
    auVar87._20_4_ = fVar330;
    auVar87._24_4_ = fVar333;
    auVar87._28_4_ = fVar336;
    auVar122 = vperm2f128_avx(auVar87,auVar87,1);
    auVar122 = vshufps_avx(auVar122,auVar87,0x30);
    auVar215 = vshufps_avx(auVar87,auVar122,0x29);
    auVar33 = vsubps_avx(_local_a80,auVar35);
    auVar122 = vperm2f128_avx(auVar33,auVar33,1);
    auVar122 = vshufps_avx(auVar122,auVar33,0x30);
    auVar243 = vshufps_avx(auVar33,auVar122,0x29);
    auVar34 = vsubps_avx(local_a20,auVar89);
    local_2e0 = vsubps_avx(auVar215,auVar87);
    fVar298 = auVar34._0_4_;
    fVar253 = auVar34._4_4_;
    auVar31._4_4_ = fVar389 * fVar253;
    auVar31._0_4_ = fVar385 * fVar298;
    fVar275 = auVar34._8_4_;
    auVar31._8_4_ = fVar391 * fVar275;
    fVar286 = auVar34._12_4_;
    auVar31._12_4_ = fVar393 * fVar286;
    fVar305 = auVar34._16_4_;
    auVar31._16_4_ = fVar395 * fVar305;
    fVar331 = auVar34._20_4_;
    auVar31._20_4_ = fVar397 * fVar331;
    fVar19 = auVar34._24_4_;
    auVar31._24_4_ = fVar399 * fVar19;
    auVar31._28_4_ = auVar33._28_4_;
    fVar347 = local_2e0._0_4_;
    fVar262 = local_2e0._4_4_;
    auVar36._4_4_ = fVar367 * fVar262;
    auVar36._0_4_ = fVar361 * fVar347;
    fVar258 = local_2e0._8_4_;
    auVar36._8_4_ = fVar368 * fVar258;
    fVar288 = local_2e0._12_4_;
    auVar36._12_4_ = fVar369 * fVar288;
    fVar306 = local_2e0._16_4_;
    auVar36._16_4_ = fVar370 * fVar306;
    fVar334 = local_2e0._20_4_;
    auVar36._20_4_ = fVar371 * fVar334;
    fVar20 = local_2e0._24_4_;
    auVar36._24_4_ = fVar372 * fVar20;
    auVar36._28_4_ = auVar122._28_4_;
    auVar35 = vsubps_avx(auVar36,auVar31);
    auVar93._4_4_ = fStack_99c;
    auVar93._0_4_ = local_9a0;
    auVar93._8_4_ = fStack_998;
    auVar93._12_4_ = fStack_994;
    auVar93._16_4_ = fStack_990;
    auVar93._20_4_ = fStack_98c;
    auVar93._24_4_ = fStack_988;
    auVar93._28_4_ = fStack_984;
    auVar122 = vperm2f128_avx(auVar93,auVar93,1);
    auVar122 = vshufps_avx(auVar122,auVar93,0x30);
    auVar31 = vshufps_avx(auVar93,auVar122,0x29);
    local_620 = vsubps_avx(auVar31,auVar93);
    auVar37._4_4_ = fVar379 * fVar262;
    auVar37._0_4_ = fVar374 * fVar347;
    auVar37._8_4_ = fVar380 * fVar258;
    auVar37._12_4_ = fVar381 * fVar288;
    auVar37._16_4_ = fVar382 * fVar306;
    auVar37._20_4_ = fVar383 * fVar334;
    auVar37._24_4_ = fVar384 * fVar20;
    auVar37._28_4_ = auVar122._28_4_;
    fVar261 = local_620._0_4_;
    fVar360 = local_620._4_4_;
    auVar38._4_4_ = fVar389 * fVar360;
    auVar38._0_4_ = fVar385 * fVar261;
    fVar276 = local_620._8_4_;
    auVar38._8_4_ = fVar391 * fVar276;
    fVar289 = local_620._12_4_;
    auVar38._12_4_ = fVar393 * fVar289;
    fVar307 = local_620._16_4_;
    auVar38._16_4_ = fVar395 * fVar307;
    fVar348 = local_620._20_4_;
    auVar38._20_4_ = fVar397 * fVar348;
    fVar21 = local_620._24_4_;
    auVar38._24_4_ = fVar399 * fVar21;
    auVar38._28_4_ = fVar349;
    auVar36 = vsubps_avx(auVar38,auVar37);
    auVar294._4_4_ = fVar367 * fVar360;
    auVar294._0_4_ = fVar361 * fVar261;
    auVar294._8_4_ = fVar368 * fVar276;
    auVar294._12_4_ = fVar369 * fVar289;
    auVar294._16_4_ = fVar370 * fVar307;
    auVar294._20_4_ = fVar371 * fVar348;
    auVar294._24_4_ = fVar372 * fVar21;
    auVar294._28_4_ = fVar349;
    auVar32._4_4_ = fVar379 * fVar253;
    auVar32._0_4_ = fVar374 * fVar298;
    auVar32._8_4_ = fVar380 * fVar275;
    auVar32._12_4_ = fVar381 * fVar286;
    auVar32._16_4_ = fVar382 * fVar305;
    auVar32._20_4_ = fVar383 * fVar331;
    auVar32._24_4_ = fVar384 * fVar19;
    auVar32._28_4_ = uStack_1e4;
    auVar37 = vsubps_avx(auVar32,auVar294);
    fVar337 = auVar37._28_4_;
    auVar193._0_4_ = fVar261 * fVar261 + fVar298 * fVar298 + fVar347 * fVar347;
    auVar193._4_4_ = fVar360 * fVar360 + fVar253 * fVar253 + fVar262 * fVar262;
    auVar193._8_4_ = fVar276 * fVar276 + fVar275 * fVar275 + fVar258 * fVar258;
    auVar193._12_4_ = fVar289 * fVar289 + fVar286 * fVar286 + fVar288 * fVar288;
    auVar193._16_4_ = fVar307 * fVar307 + fVar305 * fVar305 + fVar306 * fVar306;
    auVar193._20_4_ = fVar348 * fVar348 + fVar331 * fVar331 + fVar334 * fVar334;
    auVar193._24_4_ = fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20;
    auVar193._28_4_ = fVar337 + fVar337 + auVar35._28_4_;
    auVar122 = vrcpps_avx(auVar193);
    fVar285 = auVar122._0_4_;
    fVar301 = auVar122._4_4_;
    auVar42._4_4_ = fVar301 * auVar193._4_4_;
    auVar42._0_4_ = fVar285 * auVar193._0_4_;
    fVar303 = auVar122._8_4_;
    auVar42._8_4_ = fVar303 * auVar193._8_4_;
    fVar304 = auVar122._12_4_;
    auVar42._12_4_ = fVar304 * auVar193._12_4_;
    fVar322 = auVar122._16_4_;
    auVar42._16_4_ = fVar322 * auVar193._16_4_;
    fVar325 = auVar122._20_4_;
    auVar42._20_4_ = fVar325 * auVar193._20_4_;
    fVar328 = auVar122._24_4_;
    auVar42._24_4_ = fVar328 * auVar193._24_4_;
    auVar42._28_4_ = uStack_1e4;
    auVar159._8_4_ = 0x3f800000;
    auVar159._0_8_ = 0x3f8000003f800000;
    auVar159._12_4_ = 0x3f800000;
    auVar159._16_4_ = 0x3f800000;
    auVar159._20_4_ = 0x3f800000;
    auVar159._24_4_ = 0x3f800000;
    auVar159._28_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar159,auVar42);
    fVar285 = fVar285 + fVar285 * auVar38._0_4_;
    fVar301 = fVar301 + fVar301 * auVar38._4_4_;
    fVar303 = fVar303 + fVar303 * auVar38._8_4_;
    fVar304 = fVar304 + fVar304 * auVar38._12_4_;
    fVar322 = fVar322 + fVar322 * auVar38._16_4_;
    fVar325 = fVar325 + fVar325 * auVar38._20_4_;
    fVar328 = fVar328 + fVar328 * auVar38._24_4_;
    auVar33 = vperm2f128_avx(auVar39,auVar39,1);
    auVar33 = vshufps_avx(auVar33,auVar39,0x30);
    local_a00 = vshufps_avx(auVar39,auVar33,0x29);
    auVar33 = vperm2f128_avx(auVar40,auVar40,1);
    auVar33 = vshufps_avx(auVar33,auVar40,0x30);
    local_8a0 = vshufps_avx(auVar40,auVar33,0x29);
    fVar386 = local_8a0._0_4_;
    fVar390 = local_8a0._4_4_;
    auVar43._4_4_ = fVar390 * fVar253;
    auVar43._0_4_ = fVar386 * fVar298;
    fVar392 = local_8a0._8_4_;
    auVar43._8_4_ = fVar392 * fVar275;
    fVar394 = local_8a0._12_4_;
    auVar43._12_4_ = fVar394 * fVar286;
    fVar396 = local_8a0._16_4_;
    auVar43._16_4_ = fVar396 * fVar305;
    fVar398 = local_8a0._20_4_;
    auVar43._20_4_ = fVar398 * fVar331;
    fVar400 = local_8a0._24_4_;
    auVar43._24_4_ = fVar400 * fVar19;
    auVar43._28_4_ = auVar33._28_4_;
    fVar270 = local_a00._0_4_;
    fVar254 = local_a00._4_4_;
    auVar44._4_4_ = fVar262 * fVar254;
    auVar44._0_4_ = fVar347 * fVar270;
    fVar279 = local_a00._8_4_;
    auVar44._8_4_ = fVar258 * fVar279;
    fVar292 = local_a00._12_4_;
    auVar44._12_4_ = fVar288 * fVar292;
    fVar316 = local_a00._16_4_;
    auVar44._16_4_ = fVar306 * fVar316;
    fVar349 = local_a00._20_4_;
    auVar44._20_4_ = fVar334 * fVar349;
    fVar22 = local_a00._24_4_;
    auVar44._24_4_ = fVar20 * fVar22;
    auVar44._28_4_ = fStack_204;
    auVar39 = vsubps_avx(auVar44,auVar43);
    auVar33 = vperm2f128_avx(auVar41,auVar41,1);
    auVar33 = vshufps_avx(auVar33,auVar41,0x30);
    local_880 = vshufps_avx(auVar41,auVar33,0x29);
    fVar274 = local_880._0_4_;
    fVar255 = local_880._4_4_;
    auVar45._4_4_ = fVar262 * fVar255;
    auVar45._0_4_ = fVar347 * fVar274;
    fVar280 = local_880._8_4_;
    auVar45._8_4_ = fVar258 * fVar280;
    fVar299 = local_880._12_4_;
    auVar45._12_4_ = fVar288 * fVar299;
    fVar319 = local_880._16_4_;
    auVar45._16_4_ = fVar306 * fVar319;
    fVar373 = local_880._20_4_;
    auVar45._20_4_ = fVar334 * fVar373;
    fVar23 = local_880._24_4_;
    auVar45._24_4_ = fVar20 * fVar23;
    auVar45._28_4_ = auVar33._28_4_;
    auVar46._4_4_ = fVar390 * fVar360;
    auVar46._0_4_ = fVar386 * fVar261;
    auVar46._8_4_ = fVar392 * fVar276;
    auVar46._12_4_ = fVar394 * fVar289;
    auVar46._16_4_ = fVar396 * fVar307;
    auVar46._20_4_ = fVar398 * fVar348;
    auVar46._24_4_ = fVar400 * fVar21;
    auVar46._28_4_ = uStack_1c4;
    auVar33 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ = fVar360 * fVar254;
    auVar47._0_4_ = fVar261 * fVar270;
    auVar47._8_4_ = fVar276 * fVar279;
    auVar47._12_4_ = fVar289 * fVar292;
    auVar47._16_4_ = fVar307 * fVar316;
    auVar47._20_4_ = fVar348 * fVar349;
    auVar47._24_4_ = fVar21 * fVar22;
    auVar47._28_4_ = uStack_1c4;
    auVar49._4_4_ = fVar255 * fVar253;
    auVar49._0_4_ = fVar274 * fVar298;
    auVar49._8_4_ = fVar280 * fVar275;
    auVar49._12_4_ = fVar299 * fVar286;
    auVar49._16_4_ = fVar319 * fVar305;
    auVar49._20_4_ = fVar373 * fVar331;
    fVar48 = local_8a0._28_4_;
    auVar49._24_4_ = fVar23 * fVar19;
    auVar49._28_4_ = fVar48;
    auVar40 = vsubps_avx(auVar49,auVar47);
    auVar50._4_4_ =
         fVar301 * (auVar35._4_4_ * auVar35._4_4_ +
                   auVar37._4_4_ * auVar37._4_4_ + auVar36._4_4_ * auVar36._4_4_);
    auVar50._0_4_ =
         fVar285 * (auVar35._0_4_ * auVar35._0_4_ +
                   auVar37._0_4_ * auVar37._0_4_ + auVar36._0_4_ * auVar36._0_4_);
    auVar50._8_4_ =
         fVar303 * (auVar35._8_4_ * auVar35._8_4_ +
                   auVar37._8_4_ * auVar37._8_4_ + auVar36._8_4_ * auVar36._8_4_);
    auVar50._12_4_ =
         fVar304 * (auVar35._12_4_ * auVar35._12_4_ +
                   auVar37._12_4_ * auVar37._12_4_ + auVar36._12_4_ * auVar36._12_4_);
    auVar50._16_4_ =
         fVar322 * (auVar35._16_4_ * auVar35._16_4_ +
                   auVar37._16_4_ * auVar37._16_4_ + auVar36._16_4_ * auVar36._16_4_);
    auVar50._20_4_ =
         fVar325 * (auVar35._20_4_ * auVar35._20_4_ +
                   auVar37._20_4_ * auVar37._20_4_ + auVar36._20_4_ * auVar36._20_4_);
    auVar50._24_4_ =
         fVar328 * (auVar35._24_4_ * auVar35._24_4_ +
                   auVar37._24_4_ * auVar37._24_4_ + auVar36._24_4_ * auVar36._24_4_);
    auVar50._28_4_ = auVar35._28_4_ + fVar337 + auVar36._28_4_;
    auVar51._4_4_ =
         (auVar39._4_4_ * auVar39._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar40._4_4_ * auVar40._4_4_) * fVar301;
    auVar51._0_4_ =
         (auVar39._0_4_ * auVar39._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar40._0_4_ * auVar40._0_4_) * fVar285;
    auVar51._8_4_ =
         (auVar39._8_4_ * auVar39._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar40._8_4_ * auVar40._8_4_) * fVar303;
    auVar51._12_4_ =
         (auVar39._12_4_ * auVar39._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar40._12_4_ * auVar40._12_4_) * fVar304;
    auVar51._16_4_ =
         (auVar39._16_4_ * auVar39._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar40._16_4_ * auVar40._16_4_) * fVar322;
    auVar51._20_4_ =
         (auVar39._20_4_ * auVar39._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar40._20_4_ * auVar40._20_4_) * fVar325;
    auVar51._24_4_ =
         (auVar39._24_4_ * auVar39._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar40._24_4_ * auVar40._24_4_) * fVar328;
    auVar51._28_4_ = auVar122._28_4_ + auVar38._28_4_;
    auVar122 = vmaxps_avx(auVar50,auVar51);
    auVar33 = vperm2f128_avx(_local_a80,_local_a80,1);
    auVar33 = vshufps_avx(auVar33,_local_a80,0x30);
    auVar36 = vshufps_avx(_local_a80,auVar33,0x29);
    auVar123._0_4_ = (float)local_a80._0_4_ + fVar233;
    auVar123._4_4_ = (float)local_a80._4_4_ + fVar271;
    auVar123._8_4_ = fStack_a78 + fVar272;
    auVar123._12_4_ = fStack_a74 + fVar283;
    auVar123._16_4_ = fStack_a70 + fVar278;
    auVar123._20_4_ = fStack_a6c + fVar252;
    auVar123._24_4_ = fStack_a68 + fVar256;
    auVar123._28_4_ = fStack_a64 + fVar282;
    auVar33 = vmaxps_avx(_local_a80,auVar123);
    auVar35 = vmaxps_avx(auVar243,auVar36);
    auVar33 = vmaxps_avx(auVar33,auVar35);
    auVar35 = vrsqrtps_avx(auVar193);
    fVar337 = auVar35._0_4_;
    fVar278 = auVar35._4_4_;
    fVar233 = auVar35._8_4_;
    fVar252 = auVar35._12_4_;
    fVar271 = auVar35._16_4_;
    fVar256 = auVar35._20_4_;
    fVar272 = auVar35._24_4_;
    auVar52._4_4_ = fVar278 * fVar278 * fVar278 * auVar193._4_4_ * 0.5;
    auVar52._0_4_ = fVar337 * fVar337 * fVar337 * auVar193._0_4_ * 0.5;
    auVar52._8_4_ = fVar233 * fVar233 * fVar233 * auVar193._8_4_ * 0.5;
    auVar52._12_4_ = fVar252 * fVar252 * fVar252 * auVar193._12_4_ * 0.5;
    auVar52._16_4_ = fVar271 * fVar271 * fVar271 * auVar193._16_4_ * 0.5;
    auVar52._20_4_ = fVar256 * fVar256 * fVar256 * auVar193._20_4_ * 0.5;
    auVar52._24_4_ = fVar272 * fVar272 * fVar272 * auVar193._24_4_ * 0.5;
    auVar52._28_4_ = auVar193._28_4_;
    auVar53._4_4_ = fVar278 * 1.5;
    auVar53._0_4_ = fVar337 * 1.5;
    auVar53._8_4_ = fVar233 * 1.5;
    auVar53._12_4_ = fVar252 * 1.5;
    auVar53._16_4_ = fVar271 * 1.5;
    auVar53._20_4_ = fVar256 * 1.5;
    auVar53._24_4_ = fVar272 * 1.5;
    auVar53._28_4_ = auVar35._28_4_;
    local_3a0 = vsubps_avx(auVar53,auVar52);
    auVar90._4_4_ = fVar317;
    auVar90._0_4_ = fVar308;
    auVar90._8_4_ = fVar320;
    auVar90._12_4_ = fVar323;
    auVar90._16_4_ = fVar326;
    auVar90._20_4_ = fVar329;
    auVar90._24_4_ = fVar332;
    auVar90._28_4_ = fVar335;
    local_8c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
    auVar88._4_4_ = fVar318;
    auVar88._0_4_ = fVar309;
    auVar88._8_4_ = fVar321;
    auVar88._12_4_ = fVar324;
    auVar88._16_4_ = fVar327;
    auVar88._20_4_ = fVar330;
    auVar88._24_4_ = fVar333;
    auVar88._28_4_ = fVar336;
    auVar37 = vsubps_avx(ZEXT832(0) << 0x20,auVar88);
    auVar353 = ZEXT3264(auVar37);
    fVar350 = auVar37._0_4_;
    fVar354 = auVar37._4_4_;
    fVar355 = auVar37._8_4_;
    fVar356 = auVar37._12_4_;
    fVar357 = auVar37._16_4_;
    fVar358 = auVar37._20_4_;
    fVar359 = auVar37._24_4_;
    fVar278 = local_8c0._0_4_;
    fVar271 = local_8c0._4_4_;
    fVar282 = local_8c0._8_4_;
    fVar301 = local_8c0._12_4_;
    fVar322 = local_8c0._16_4_;
    fVar404 = local_8c0._20_4_;
    fVar24 = local_8c0._24_4_;
    auVar294 = ZEXT832(0) << 0x20;
    auVar37 = vsubps_avx(auVar294,auVar93);
    fVar233 = auVar37._0_4_;
    fVar256 = auVar37._4_4_;
    fVar283 = auVar37._8_4_;
    fVar303 = auVar37._12_4_;
    fVar325 = auVar37._16_4_;
    fVar406 = auVar37._20_4_;
    fVar25 = auVar37._24_4_;
    auVar341._0_4_ =
         (float)local_920._0_4_ * fVar233 +
         (float)local_760._0_4_ * fVar278 + fVar350 * (float)local_780._0_4_;
    auVar341._4_4_ =
         (float)local_920._4_4_ * fVar256 +
         (float)local_760._4_4_ * fVar271 + fVar354 * (float)local_780._4_4_;
    auVar341._8_4_ = fStack_918 * fVar283 + fStack_758 * fVar282 + fVar355 * fStack_778;
    auVar341._12_4_ = fStack_914 * fVar303 + fStack_754 * fVar301 + fVar356 * fStack_774;
    auVar341._16_4_ = fStack_910 * fVar325 + fStack_750 * fVar322 + fVar357 * fStack_770;
    auVar341._20_4_ = fStack_90c * fVar406 + fStack_74c * fVar404 + fVar358 * fStack_76c;
    auVar341._24_4_ = fStack_908 * fVar25 + fStack_748 * fVar24 + fVar359 * fStack_768;
    auVar341._28_4_ = auVar40._28_4_ + auVar35._28_4_ + auVar193._28_4_;
    auVar377._0_4_ = fVar233 * fVar233 + fVar278 * fVar278 + fVar350 * fVar350;
    auVar377._4_4_ = fVar256 * fVar256 + fVar271 * fVar271 + fVar354 * fVar354;
    auVar377._8_4_ = fVar283 * fVar283 + fVar282 * fVar282 + fVar355 * fVar355;
    auVar377._12_4_ = fVar303 * fVar303 + fVar301 * fVar301 + fVar356 * fVar356;
    auVar377._16_4_ = fVar325 * fVar325 + fVar322 * fVar322 + fVar357 * fVar357;
    auVar377._20_4_ = fVar406 * fVar406 + fVar404 * fVar404 + fVar358 * fVar358;
    auVar377._24_4_ = fVar25 * fVar25 + fVar24 * fVar24 + fVar359 * fVar359;
    auVar377._28_4_ = fVar48 + fVar48 + auVar40._28_4_;
    local_300 = auVar34;
    fVar252 = local_3a0._0_4_;
    fVar272 = local_3a0._4_4_;
    fVar285 = local_3a0._8_4_;
    fVar304 = local_3a0._12_4_;
    fVar328 = local_3a0._16_4_;
    fVar257 = local_3a0._20_4_;
    fVar259 = local_3a0._24_4_;
    local_660 = (float)local_920._0_4_ * fVar261 * fVar252 +
                fVar298 * fVar252 * (float)local_760._0_4_ +
                fVar347 * fVar252 * (float)local_780._0_4_;
    fStack_65c = (float)local_920._4_4_ * fVar360 * fVar272 +
                 fVar253 * fVar272 * (float)local_760._4_4_ +
                 fVar262 * fVar272 * (float)local_780._4_4_;
    fStack_658 = fStack_918 * fVar276 * fVar285 +
                 fVar275 * fVar285 * fStack_758 + fVar258 * fVar285 * fStack_778;
    fStack_654 = fStack_914 * fVar289 * fVar304 +
                 fVar286 * fVar304 * fStack_754 + fVar288 * fVar304 * fStack_774;
    fStack_650 = fStack_910 * fVar307 * fVar328 +
                 fVar305 * fVar328 * fStack_750 + fVar306 * fVar328 * fStack_770;
    fStack_64c = fStack_90c * fVar348 * fVar257 +
                 fVar331 * fVar257 * fStack_74c + fVar334 * fVar257 * fStack_76c;
    fStack_648 = fStack_908 * fVar21 * fVar259 +
                 fVar19 * fVar259 * fStack_748 + fVar20 * fVar259 * fStack_768;
    fStack_644 = fStack_904 + fStack_744 + fStack_764;
    fVar337 = fStack_904 + fStack_744 + fStack_764;
    local_680._0_4_ =
         fVar233 * fVar261 * fVar252 + fVar298 * fVar252 * fVar278 + fVar350 * fVar347 * fVar252;
    local_680._4_4_ =
         fVar256 * fVar360 * fVar272 + fVar253 * fVar272 * fVar271 + fVar354 * fVar262 * fVar272;
    local_680._8_4_ =
         fVar283 * fVar276 * fVar285 + fVar275 * fVar285 * fVar282 + fVar355 * fVar258 * fVar285;
    local_680._12_4_ =
         fVar303 * fVar289 * fVar304 + fVar286 * fVar304 * fVar301 + fVar356 * fVar288 * fVar304;
    local_680._16_4_ =
         fVar325 * fVar307 * fVar328 + fVar305 * fVar328 * fVar322 + fVar357 * fVar306 * fVar328;
    local_680._20_4_ =
         fVar406 * fVar348 * fVar257 + fVar331 * fVar257 * fVar404 + fVar358 * fVar334 * fVar257;
    local_680._24_4_ =
         fVar25 * fVar21 * fVar259 + fVar19 * fVar259 * fVar24 + fVar359 * fVar20 * fVar259;
    local_680._28_4_ = fStack_744 + fVar337;
    auVar54._4_4_ = fStack_65c * local_680._4_4_;
    auVar54._0_4_ = local_660 * local_680._0_4_;
    auVar54._8_4_ = fStack_658 * local_680._8_4_;
    auVar54._12_4_ = fStack_654 * local_680._12_4_;
    auVar54._16_4_ = fStack_650 * local_680._16_4_;
    auVar54._20_4_ = fStack_64c * local_680._20_4_;
    auVar54._24_4_ = fStack_648 * local_680._24_4_;
    auVar54._28_4_ = fVar337;
    auVar35 = vsubps_avx(auVar341,auVar54);
    auVar55._4_4_ = local_680._4_4_ * local_680._4_4_;
    auVar55._0_4_ = local_680._0_4_ * local_680._0_4_;
    auVar55._8_4_ = local_680._8_4_ * local_680._8_4_;
    auVar55._12_4_ = local_680._12_4_ * local_680._12_4_;
    auVar55._16_4_ = local_680._16_4_ * local_680._16_4_;
    auVar55._20_4_ = local_680._20_4_ * local_680._20_4_;
    auVar55._24_4_ = local_680._24_4_ * local_680._24_4_;
    auVar55._28_4_ = fStack_744;
    auVar38 = vsubps_avx(auVar377,auVar55);
    local_2c0 = vsqrtps_avx(auVar122);
    local_c80._0_4_ = auVar33._0_4_;
    local_c80._4_4_ = auVar33._4_4_;
    fStack_c78 = auVar33._8_4_;
    fStack_c74 = auVar33._12_4_;
    fStack_c70 = auVar33._16_4_;
    fStack_c6c = auVar33._20_4_;
    fStack_c68 = auVar33._24_4_;
    fStack_c64 = auVar33._28_4_;
    fVar337 = (local_2c0._0_4_ + (float)local_c80._0_4_) * 1.0000002;
    fVar134 = (local_2c0._4_4_ + (float)local_c80._4_4_) * 1.0000002;
    fVar136 = (local_2c0._8_4_ + fStack_c78) * 1.0000002;
    fVar138 = (local_2c0._12_4_ + fStack_c74) * 1.0000002;
    fVar140 = (local_2c0._16_4_ + fStack_c70) * 1.0000002;
    fVar142 = (local_2c0._20_4_ + fStack_c6c) * 1.0000002;
    fVar144 = (local_2c0._24_4_ + fStack_c68) * 1.0000002;
    auVar56._4_4_ = fVar134 * fVar134;
    auVar56._0_4_ = fVar337 * fVar337;
    auVar56._8_4_ = fVar136 * fVar136;
    auVar56._12_4_ = fVar138 * fVar138;
    auVar56._16_4_ = fVar140 * fVar140;
    auVar56._20_4_ = fVar142 * fVar142;
    auVar56._24_4_ = fVar144 * fVar144;
    auVar56._28_4_ = local_2c0._28_4_ + fStack_c64;
    local_400._0_4_ = auVar35._0_4_ + auVar35._0_4_;
    local_400._4_4_ = auVar35._4_4_ + auVar35._4_4_;
    local_400._8_4_ = auVar35._8_4_ + auVar35._8_4_;
    local_400._12_4_ = auVar35._12_4_ + auVar35._12_4_;
    local_400._16_4_ = auVar35._16_4_ + auVar35._16_4_;
    local_400._20_4_ = auVar35._20_4_ + auVar35._20_4_;
    local_400._24_4_ = auVar35._24_4_ + auVar35._24_4_;
    fVar337 = auVar35._28_4_;
    local_400._28_4_ = fVar337 + fVar337;
    auVar33 = vsubps_avx(auVar38,auVar56);
    auVar57._4_4_ = fStack_65c * fStack_65c;
    auVar57._0_4_ = local_660 * local_660;
    auVar57._8_4_ = fStack_658 * fStack_658;
    auVar57._12_4_ = fStack_654 * fStack_654;
    auVar57._16_4_ = fStack_650 * fStack_650;
    auVar57._20_4_ = fStack_64c * fStack_64c;
    auVar57._24_4_ = fStack_648 * fStack_648;
    auVar57._28_4_ = fVar337;
    auVar35 = vsubps_avx(local_2a0,auVar57);
    auVar58._4_4_ = local_400._4_4_ * local_400._4_4_;
    auVar58._0_4_ = local_400._0_4_ * local_400._0_4_;
    auVar58._8_4_ = local_400._8_4_ * local_400._8_4_;
    auVar58._12_4_ = local_400._12_4_ * local_400._12_4_;
    auVar58._16_4_ = local_400._16_4_ * local_400._16_4_;
    auVar58._20_4_ = local_400._20_4_ * local_400._20_4_;
    auVar58._24_4_ = local_400._24_4_ * local_400._24_4_;
    auVar58._28_4_ = 0x3f800002;
    fVar337 = auVar35._0_4_;
    fVar134 = auVar35._4_4_;
    fVar136 = auVar35._8_4_;
    fVar138 = auVar35._12_4_;
    fVar140 = auVar35._16_4_;
    fStack_730 = fVar140 * 4.0;
    fVar142 = auVar35._20_4_;
    fStack_72c = fVar142 * 4.0;
    fVar144 = auVar35._24_4_;
    fStack_728 = fVar144 * 4.0;
    uStack_724 = 0x40800000;
    auVar59._4_4_ = auVar33._4_4_ * fVar134 * 4.0;
    auVar59._0_4_ = auVar33._0_4_ * fVar337 * 4.0;
    auVar59._8_4_ = auVar33._8_4_ * fVar136 * 4.0;
    auVar59._12_4_ = auVar33._12_4_ * fVar138 * 4.0;
    auVar59._16_4_ = auVar33._16_4_ * fStack_730;
    auVar59._20_4_ = auVar33._20_4_ * fStack_72c;
    auVar59._24_4_ = auVar33._24_4_ * fStack_728;
    auVar59._28_4_ = 0x40800000;
    auVar39 = vsubps_avx(auVar58,auVar59);
    auVar122 = vcmpps_avx(auVar39,auVar294,5);
    auVar226._8_4_ = 0x7fffffff;
    auVar226._0_8_ = 0x7fffffff7fffffff;
    auVar226._12_4_ = 0x7fffffff;
    auVar226._16_4_ = 0x7fffffff;
    auVar226._20_4_ = 0x7fffffff;
    auVar226._24_4_ = 0x7fffffff;
    auVar226._28_4_ = 0x7fffffff;
    local_3c0 = vandps_avx(auVar57,auVar226);
    local_320._0_4_ = fVar337 + fVar337;
    local_320._4_4_ = fVar134 + fVar134;
    local_320._8_4_ = fVar136 + fVar136;
    local_320._12_4_ = fVar138 + fVar138;
    local_320._16_4_ = fVar140 + fVar140;
    local_320._20_4_ = fVar142 + fVar142;
    local_320._24_4_ = fVar144 + fVar144;
    local_320._28_4_ = auVar35._28_4_ + auVar35._28_4_;
    local_3e0 = vandps_avx(auVar35,auVar226);
    uVar98 = CONCAT44(local_400._4_4_,local_400._0_4_);
    local_9c0._0_8_ = uVar98 ^ 0x8000000080000000;
    local_9c0._8_4_ = -local_400._8_4_;
    local_9c0._12_4_ = -local_400._12_4_;
    local_9c0._16_4_ = -local_400._16_4_;
    local_9c0._20_4_ = -local_400._20_4_;
    local_9c0._24_4_ = -local_400._24_4_;
    local_9c0._28_4_ = -local_400._28_4_;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0x7f,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0xbf,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
    {
      fStack_c78 = INFINITY;
      local_c80 = (undefined1  [8])0x7f8000007f800000;
      fStack_c74 = INFINITY;
      fStack_c70 = INFINITY;
      fStack_c6c = INFINITY;
      fStack_c68 = INFINITY;
      fStack_c64 = INFINITY;
      auVar124._8_4_ = 0xff800000;
      auVar124._0_8_ = 0xff800000ff800000;
      auVar124._12_4_ = 0xff800000;
      auVar124._16_4_ = 0xff800000;
      auVar124._20_4_ = 0xff800000;
      auVar124._24_4_ = 0xff800000;
      auVar124._28_4_ = 0xff800000;
    }
    else {
      auVar32 = vsqrtps_avx(auVar39);
      auVar40 = vrcpps_avx(local_320);
      auVar35 = vcmpps_avx(auVar39,auVar294,5);
      fVar140 = auVar40._0_4_;
      fVar142 = auVar40._4_4_;
      auVar60._4_4_ = local_320._4_4_ * fVar142;
      auVar60._0_4_ = local_320._0_4_ * fVar140;
      fVar144 = auVar40._8_4_;
      auVar60._8_4_ = local_320._8_4_ * fVar144;
      fVar139 = auVar40._12_4_;
      auVar60._12_4_ = local_320._12_4_ * fVar139;
      fVar141 = auVar40._16_4_;
      auVar60._16_4_ = local_320._16_4_ * fVar141;
      fVar143 = auVar40._20_4_;
      auVar60._20_4_ = local_320._20_4_ * fVar143;
      fVar145 = auVar40._24_4_;
      auVar60._24_4_ = local_320._24_4_ * fVar145;
      auVar60._28_4_ = auVar39._28_4_;
      auVar227._8_4_ = 0x3f800000;
      auVar227._0_8_ = 0x3f8000003f800000;
      auVar227._12_4_ = 0x3f800000;
      auVar227._16_4_ = 0x3f800000;
      auVar227._20_4_ = 0x3f800000;
      auVar227._24_4_ = 0x3f800000;
      auVar227._28_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar227,auVar60);
      fVar140 = fVar140 + fVar140 * auVar39._0_4_;
      fVar142 = fVar142 + fVar142 * auVar39._4_4_;
      fVar144 = fVar144 + fVar144 * auVar39._8_4_;
      fVar139 = fVar139 + fVar139 * auVar39._12_4_;
      fVar141 = fVar141 + fVar141 * auVar39._16_4_;
      fVar143 = fVar143 + fVar143 * auVar39._20_4_;
      fVar145 = fVar145 + fVar145 * auVar39._24_4_;
      auVar294 = vsubps_avx(local_9c0,auVar32);
      fVar260 = auVar294._0_4_ * fVar140;
      fVar273 = auVar294._4_4_ * fVar142;
      auVar61._4_4_ = fVar273;
      auVar61._0_4_ = fVar260;
      fVar277 = auVar294._8_4_ * fVar144;
      auVar61._8_4_ = fVar277;
      fVar281 = auVar294._12_4_ * fVar139;
      auVar61._12_4_ = fVar281;
      fVar284 = auVar294._16_4_ * fVar141;
      auVar61._16_4_ = fVar284;
      fVar287 = auVar294._20_4_ * fVar143;
      auVar61._20_4_ = fVar287;
      fVar290 = auVar294._24_4_ * fVar145;
      auVar61._24_4_ = fVar290;
      auVar61._28_4_ = auVar294._28_4_;
      auVar294 = vsubps_avx(auVar32,local_400);
      fVar140 = auVar294._0_4_ * fVar140;
      fVar142 = auVar294._4_4_ * fVar142;
      auVar62._4_4_ = fVar142;
      auVar62._0_4_ = fVar140;
      fVar144 = auVar294._8_4_ * fVar144;
      auVar62._8_4_ = fVar144;
      fVar139 = auVar294._12_4_ * fVar139;
      auVar62._12_4_ = fVar139;
      fVar141 = auVar294._16_4_ * fVar141;
      auVar62._16_4_ = fVar141;
      fVar143 = auVar294._20_4_ * fVar143;
      auVar62._20_4_ = fVar143;
      fVar145 = auVar294._24_4_ * fVar145;
      auVar62._24_4_ = fVar145;
      auVar62._28_4_ = auVar40._28_4_ + auVar39._28_4_;
      fStack_364 = local_680._28_4_ + auVar294._28_4_;
      local_380 = fVar252 * (local_680._0_4_ + local_660 * fVar260);
      fStack_37c = fVar272 * (local_680._4_4_ + fStack_65c * fVar273);
      fStack_378 = fVar285 * (local_680._8_4_ + fStack_658 * fVar277);
      fStack_374 = fVar304 * (local_680._12_4_ + fStack_654 * fVar281);
      fStack_370 = fVar328 * (local_680._16_4_ + fStack_650 * fVar284);
      fStack_36c = fVar257 * (local_680._20_4_ + fStack_64c * fVar287);
      fStack_368 = fVar259 * (local_680._24_4_ + fStack_648 * fVar290);
      local_360 = fVar252 * (local_680._0_4_ + local_660 * fVar140);
      fStack_35c = fVar272 * (local_680._4_4_ + fStack_65c * fVar142);
      fStack_358 = fVar285 * (local_680._8_4_ + fStack_658 * fVar144);
      fStack_354 = fVar304 * (local_680._12_4_ + fStack_654 * fVar139);
      fStack_350 = fVar328 * (local_680._16_4_ + fStack_650 * fVar141);
      fStack_34c = fVar257 * (local_680._20_4_ + fStack_64c * fVar143);
      fStack_348 = fVar259 * (local_680._24_4_ + fStack_648 * fVar145);
      fStack_344 = local_680._28_4_ + fStack_364;
      auVar244._8_4_ = 0x7f800000;
      auVar244._0_8_ = 0x7f8000007f800000;
      auVar244._12_4_ = 0x7f800000;
      auVar244._16_4_ = 0x7f800000;
      auVar244._20_4_ = 0x7f800000;
      auVar244._24_4_ = 0x7f800000;
      auVar244._28_4_ = 0x7f800000;
      _local_c80 = vblendvps_avx(auVar244,auVar61,auVar35);
      auVar245._8_4_ = 0xff800000;
      auVar245._0_8_ = 0xff800000ff800000;
      auVar245._12_4_ = 0xff800000;
      auVar245._16_4_ = 0xff800000;
      auVar245._20_4_ = 0xff800000;
      auVar245._24_4_ = 0xff800000;
      auVar245._28_4_ = 0xff800000;
      auVar124 = vblendvps_avx(auVar245,auVar62,auVar35);
      auVar39 = vmaxps_avx(local_640,local_3c0);
      auVar63._4_4_ = auVar39._4_4_ * 1.9073486e-06;
      auVar63._0_4_ = auVar39._0_4_ * 1.9073486e-06;
      auVar63._8_4_ = auVar39._8_4_ * 1.9073486e-06;
      auVar63._12_4_ = auVar39._12_4_ * 1.9073486e-06;
      auVar63._16_4_ = auVar39._16_4_ * 1.9073486e-06;
      auVar63._20_4_ = auVar39._20_4_ * 1.9073486e-06;
      auVar63._24_4_ = auVar39._24_4_ * 1.9073486e-06;
      auVar63._28_4_ = auVar39._28_4_;
      auVar39 = vcmpps_avx(local_3e0,auVar63,1);
      auVar40 = auVar35 & auVar39;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar40 >> 0x7f,0) != '\0') ||
            (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar40 >> 0xbf,0) != '\0') ||
          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar40[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar39,auVar35);
        auVar237 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar39 = vcmpps_avx(auVar33,_DAT_01f7b000,2);
        auVar343._8_4_ = 0xff800000;
        auVar343._0_8_ = 0xff800000ff800000;
        auVar343._12_4_ = 0xff800000;
        auVar343._16_4_ = 0xff800000;
        auVar343._20_4_ = 0xff800000;
        auVar343._24_4_ = 0xff800000;
        auVar343._28_4_ = 0xff800000;
        auVar295._8_4_ = 0x7f800000;
        auVar295._0_8_ = 0x7f8000007f800000;
        auVar295._12_4_ = 0x7f800000;
        auVar295._16_4_ = 0x7f800000;
        auVar295._20_4_ = 0x7f800000;
        auVar295._24_4_ = 0x7f800000;
        auVar295._28_4_ = 0x7f800000;
        auVar33 = vblendvps_avx(auVar295,auVar343,auVar39);
        auVar189 = vpmovsxwd_avx(auVar237);
        auVar237 = vpunpckhwd_avx(auVar237,auVar237);
        auVar251._16_16_ = auVar237;
        auVar251._0_16_ = auVar189;
        _local_c80 = vblendvps_avx(_local_c80,auVar33,auVar251);
        auVar296._8_4_ = 0xff800000;
        auVar296._0_8_ = 0xff800000ff800000;
        auVar296._12_4_ = 0xff800000;
        auVar296._16_4_ = 0xff800000;
        auVar296._20_4_ = 0xff800000;
        auVar296._24_4_ = 0xff800000;
        auVar296._28_4_ = 0xff800000;
        auVar33 = vblendvps_avx(auVar296,auVar295,auVar39);
        auVar124 = vblendvps_avx(auVar124,auVar33,auVar251);
        auVar217._0_8_ = auVar122._0_8_ ^ 0xffffffffffffffff;
        auVar217._8_4_ = auVar122._8_4_ ^ 0xffffffff;
        auVar217._12_4_ = auVar122._12_4_ ^ 0xffffffff;
        auVar217._16_4_ = auVar122._16_4_ ^ 0xffffffff;
        auVar217._20_4_ = auVar122._20_4_ ^ 0xffffffff;
        auVar217._24_4_ = auVar122._24_4_ ^ 0xffffffff;
        auVar217._28_4_ = auVar122._28_4_ ^ 0xffffffff;
        auVar122 = vorps_avx(auVar39,auVar217);
        auVar122 = vandps_avx(auVar35,auVar122);
      }
    }
    auVar342._8_4_ = 0x7fffffff;
    auVar342._0_8_ = 0x7fffffff7fffffff;
    auVar342._12_4_ = 0x7fffffff;
    auVar342._16_4_ = 0x7fffffff;
    auVar342._20_4_ = 0x7fffffff;
    auVar342._24_4_ = 0x7fffffff;
    auVar342._28_4_ = 0x7fffffff;
    auVar366 = ZEXT3264(local_3c0);
    auVar378 = ZEXT3264(local_3e0);
    auVar344 = ZEXT3264(auVar342);
    auVar297 = ZEXT3264(_local_920);
    auVar33 = local_600 & auVar122;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      auVar366 = ZEXT3264(auVar342);
      auVar160 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_420 = auVar160;
      auVar237 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_950._0_4_));
      auVar237 = vshufps_avx(auVar237,auVar237,0);
      auVar246._16_16_ = auVar237;
      auVar246._0_16_ = auVar237;
      auVar39 = vminps_avx(auVar246,auVar124);
      fVar260 = fVar302 + auVar237._12_4_;
      auVar161._0_4_ =
           fVar374 * (float)local_920._0_4_ +
           (float)local_760._0_4_ * fVar361 + (float)local_780._0_4_ * fVar385;
      auVar161._4_4_ =
           fVar379 * (float)local_920._4_4_ +
           (float)local_760._4_4_ * fVar367 + (float)local_780._4_4_ * fVar389;
      auVar161._8_4_ = fVar380 * fStack_918 + fStack_758 * fVar368 + fStack_778 * fVar391;
      auVar161._12_4_ = fVar381 * fStack_914 + fStack_754 * fVar369 + fStack_774 * fVar393;
      auVar161._16_4_ = fVar382 * fStack_910 + fStack_750 * fVar370 + fStack_770 * fVar395;
      auVar161._20_4_ = fVar383 * fStack_90c + fStack_74c * fVar371 + fStack_76c * fVar397;
      auVar161._24_4_ = fVar384 * fStack_908 + fStack_748 * fVar372 + fStack_768 * fVar399;
      auVar161._28_4_ = local_9c0._28_4_ + fStack_204 + local_9c0._28_4_;
      auVar33 = vrcpps_avx(auVar161);
      fVar140 = auVar33._0_4_;
      fVar142 = auVar33._4_4_;
      auVar64._4_4_ = auVar161._4_4_ * fVar142;
      auVar64._0_4_ = auVar161._0_4_ * fVar140;
      fVar144 = auVar33._8_4_;
      auVar64._8_4_ = auVar161._8_4_ * fVar144;
      fVar139 = auVar33._12_4_;
      auVar64._12_4_ = auVar161._12_4_ * fVar139;
      fVar141 = auVar33._16_4_;
      auVar64._16_4_ = auVar161._16_4_ * fVar141;
      fVar143 = auVar33._20_4_;
      auVar64._20_4_ = auVar161._20_4_ * fVar143;
      fVar145 = auVar33._24_4_;
      auVar64._24_4_ = auVar161._24_4_ * fVar145;
      auVar64._28_4_ = fVar260;
      auVar352._8_4_ = 0x3f800000;
      auVar352._0_8_ = 0x3f8000003f800000;
      auVar352._12_4_ = 0x3f800000;
      auVar352._16_4_ = 0x3f800000;
      auVar352._20_4_ = 0x3f800000;
      auVar352._24_4_ = 0x3f800000;
      auVar352._28_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar352,auVar64);
      auVar33 = vandps_avx(auVar342,auVar161);
      auVar405._8_4_ = 0x219392ef;
      auVar405._0_8_ = 0x219392ef219392ef;
      auVar405._12_4_ = 0x219392ef;
      auVar405._16_4_ = 0x219392ef;
      auVar405._20_4_ = 0x219392ef;
      auVar405._24_4_ = 0x219392ef;
      auVar405._28_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar33,auVar405,1);
      auVar65._4_4_ =
           (fVar142 + fVar142 * auVar40._4_4_) *
           -(fVar379 * fVar256 + fVar367 * fVar271 + fVar354 * fVar389);
      auVar65._0_4_ =
           (fVar140 + fVar140 * auVar40._0_4_) *
           -(fVar374 * fVar233 + fVar361 * fVar278 + fVar350 * fVar385);
      auVar65._8_4_ =
           (fVar144 + fVar144 * auVar40._8_4_) *
           -(fVar380 * fVar283 + fVar368 * fVar282 + fVar355 * fVar391);
      auVar65._12_4_ =
           (fVar139 + fVar139 * auVar40._12_4_) *
           -(fVar381 * fVar303 + fVar369 * fVar301 + fVar356 * fVar393);
      auVar65._16_4_ =
           (fVar141 + fVar141 * auVar40._16_4_) *
           -(fVar382 * fVar325 + fVar370 * fVar322 + fVar357 * fVar395);
      auVar65._20_4_ =
           (fVar143 + fVar143 * auVar40._20_4_) *
           -(fVar383 * fVar406 + fVar371 * fVar404 + fVar358 * fVar397);
      auVar65._24_4_ =
           (fVar145 + fVar145 * auVar40._24_4_) *
           -(fVar384 * fVar25 + fVar372 * fVar24 + fVar359 * fVar399);
      auVar65._28_4_ = -(auVar37._28_4_ + fVar260);
      auVar353 = ZEXT3264(_local_920);
      auVar33 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,1);
      auVar33 = vorps_avx(auVar35,auVar33);
      auVar388._8_4_ = 0xff800000;
      auVar388._0_8_ = 0xff800000ff800000;
      auVar388._12_4_ = 0xff800000;
      auVar388._16_4_ = 0xff800000;
      auVar388._20_4_ = 0xff800000;
      auVar388._24_4_ = 0xff800000;
      auVar388._28_4_ = 0xff800000;
      auVar33 = vblendvps_avx(auVar65,auVar388,auVar33);
      auVar37 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,6);
      auVar35 = vorps_avx(auVar35,auVar37);
      auVar402._8_4_ = 0x7f800000;
      auVar402._0_8_ = 0x7f8000007f800000;
      auVar402._12_4_ = 0x7f800000;
      auVar402._16_4_ = 0x7f800000;
      auVar402._20_4_ = 0x7f800000;
      auVar402._24_4_ = 0x7f800000;
      auVar402._28_4_ = 0x7f800000;
      auVar35 = vblendvps_avx(auVar65,auVar402,auVar35);
      auVar37 = vmaxps_avx(local_340,_local_c80);
      auVar37 = vmaxps_avx(auVar37,auVar33);
      auVar39 = vminps_avx(auVar39,auVar35);
      auVar378 = ZEXT3264(auVar39);
      auVar294 = ZEXT832(0) << 0x20;
      auVar33 = vsubps_avx(auVar294,local_a20);
      auVar35 = vsubps_avx(auVar294,auVar215);
      auVar66._4_4_ = auVar35._4_4_ * -fVar390;
      auVar66._0_4_ = auVar35._0_4_ * -fVar386;
      auVar66._8_4_ = auVar35._8_4_ * -fVar392;
      auVar66._12_4_ = auVar35._12_4_ * -fVar394;
      auVar66._16_4_ = auVar35._16_4_ * -fVar396;
      auVar66._20_4_ = auVar35._20_4_ * -fVar398;
      auVar66._24_4_ = auVar35._24_4_ * -fVar400;
      auVar66._28_4_ = auVar35._28_4_;
      auVar67._4_4_ = fVar254 * auVar33._4_4_;
      auVar67._0_4_ = fVar270 * auVar33._0_4_;
      auVar67._8_4_ = fVar279 * auVar33._8_4_;
      auVar67._12_4_ = fVar292 * auVar33._12_4_;
      auVar67._16_4_ = fVar316 * auVar33._16_4_;
      auVar67._20_4_ = fVar349 * auVar33._20_4_;
      auVar67._24_4_ = fVar22 * auVar33._24_4_;
      auVar67._28_4_ = auVar33._28_4_;
      auVar33 = vsubps_avx(auVar66,auVar67);
      auVar35 = vsubps_avx(auVar294,auVar31);
      auVar68._4_4_ = fVar255 * auVar35._4_4_;
      auVar68._0_4_ = fVar274 * auVar35._0_4_;
      auVar68._8_4_ = fVar280 * auVar35._8_4_;
      auVar68._12_4_ = fVar299 * auVar35._12_4_;
      auVar68._16_4_ = fVar319 * auVar35._16_4_;
      auVar68._20_4_ = fVar373 * auVar35._20_4_;
      uVar8 = auVar35._28_4_;
      auVar68._24_4_ = fVar23 * auVar35._24_4_;
      auVar68._28_4_ = uVar8;
      auVar215 = vsubps_avx(auVar33,auVar68);
      auVar69._4_4_ = (float)local_780._4_4_ * -fVar390;
      auVar69._0_4_ = (float)local_780._0_4_ * -fVar386;
      auVar69._8_4_ = fStack_778 * -fVar392;
      auVar69._12_4_ = fStack_774 * -fVar394;
      auVar69._16_4_ = fStack_770 * -fVar396;
      auVar69._20_4_ = fStack_76c * -fVar398;
      auVar69._24_4_ = fStack_768 * -fVar400;
      auVar69._28_4_ = -fVar48;
      auVar70._4_4_ = (float)local_760._4_4_ * fVar254;
      auVar70._0_4_ = (float)local_760._0_4_ * fVar270;
      auVar70._8_4_ = fStack_758 * fVar279;
      auVar70._12_4_ = fStack_754 * fVar292;
      auVar70._16_4_ = fStack_750 * fVar316;
      auVar70._20_4_ = fStack_74c * fVar349;
      auVar70._24_4_ = fStack_748 * fVar22;
      auVar70._28_4_ = uVar8;
      auVar33 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = (float)local_920._4_4_ * fVar255;
      auVar71._0_4_ = (float)local_920._0_4_ * fVar274;
      auVar71._8_4_ = fStack_918 * fVar280;
      auVar71._12_4_ = fStack_914 * fVar299;
      auVar71._16_4_ = fStack_910 * fVar319;
      auVar71._20_4_ = fStack_90c * fVar373;
      auVar71._24_4_ = fStack_908 * fVar23;
      auVar71._28_4_ = uVar8;
      auVar31 = vsubps_avx(auVar33,auVar71);
      auVar33 = vrcpps_avx(auVar31);
      fVar270 = auVar33._0_4_;
      fVar274 = auVar33._4_4_;
      auVar72._4_4_ = auVar31._4_4_ * fVar274;
      auVar72._0_4_ = auVar31._0_4_ * fVar270;
      fVar278 = auVar33._8_4_;
      auVar72._8_4_ = auVar31._8_4_ * fVar278;
      fVar233 = auVar33._12_4_;
      auVar72._12_4_ = auVar31._12_4_ * fVar233;
      fVar254 = auVar33._16_4_;
      auVar72._16_4_ = auVar31._16_4_ * fVar254;
      fVar255 = auVar33._20_4_;
      auVar72._20_4_ = auVar31._20_4_ * fVar255;
      fVar271 = auVar33._24_4_;
      auVar72._24_4_ = auVar31._24_4_ * fVar271;
      auVar72._28_4_ = fStack_764;
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar125._16_4_ = 0x3f800000;
      auVar125._20_4_ = 0x3f800000;
      auVar125._24_4_ = 0x3f800000;
      auVar125._28_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar125,auVar72);
      auVar33 = vandps_avx(auVar342,auVar31);
      auVar126._8_4_ = 0x219392ef;
      auVar126._0_8_ = 0x219392ef219392ef;
      auVar126._12_4_ = 0x219392ef;
      auVar126._16_4_ = 0x219392ef;
      auVar126._20_4_ = 0x219392ef;
      auVar126._24_4_ = 0x219392ef;
      auVar126._28_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar33,auVar126,1);
      auVar73._4_4_ = (fVar274 + fVar274 * auVar40._4_4_) * -auVar215._4_4_;
      auVar73._0_4_ = (fVar270 + fVar270 * auVar40._0_4_) * -auVar215._0_4_;
      auVar73._8_4_ = (fVar278 + fVar278 * auVar40._8_4_) * -auVar215._8_4_;
      auVar73._12_4_ = (fVar233 + fVar233 * auVar40._12_4_) * -auVar215._12_4_;
      auVar73._16_4_ = (fVar254 + fVar254 * auVar40._16_4_) * -auVar215._16_4_;
      auVar73._20_4_ = (fVar255 + fVar255 * auVar40._20_4_) * -auVar215._20_4_;
      auVar73._24_4_ = (fVar271 + fVar271 * auVar40._24_4_) * -auVar215._24_4_;
      auVar73._28_4_ = auVar215._28_4_ ^ 0x80000000;
      auVar33 = vcmpps_avx(auVar31,auVar294,1);
      auVar33 = vorps_avx(auVar35,auVar33);
      auVar33 = vblendvps_avx(auVar73,auVar388,auVar33);
      local_7a0 = vmaxps_avx(auVar37,auVar33);
      auVar297 = ZEXT3264(local_7a0);
      auVar33 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,6);
      auVar33 = vorps_avx(auVar35,auVar33);
      auVar33 = vblendvps_avx(auVar73,auVar402,auVar33);
      auVar122 = vandps_avx(auVar122,local_600);
      local_440 = vminps_avx(auVar39,auVar33);
      auVar33 = vcmpps_avx(local_7a0,local_440,2);
      auVar35 = auVar122 & auVar33;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar35 >> 0x7f,0) == '\0') &&
            (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0xbf,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
      {
        auVar344 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
      }
      else {
        auVar35 = vminps_avx(_local_a80,auVar123);
        auVar215 = vminps_avx(auVar243,auVar36);
        auVar35 = vminps_avx(auVar35,auVar215);
        auVar35 = vsubps_avx(auVar35,local_2c0);
        auVar122 = vandps_avx(auVar33,auVar122);
        auVar94._4_4_ = fStack_37c;
        auVar94._0_4_ = local_380;
        auVar94._8_4_ = fStack_378;
        auVar94._12_4_ = fStack_374;
        auVar94._16_4_ = fStack_370;
        auVar94._20_4_ = fStack_36c;
        auVar94._24_4_ = fStack_368;
        auVar94._28_4_ = fStack_364;
        auVar33 = vminps_avx(auVar94,auVar125);
        auVar225 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar173 + fVar146 * (auVar33._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar199 + fVar170 * (auVar33._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar200 + fVar171 * (auVar33._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar201 + fVar172 * (auVar33._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar173 + fVar146 * (auVar33._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar199 + fVar170 * (auVar33._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar200 + fVar171 * (auVar33._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar201 + auVar33._28_4_ + 7.0;
        auVar95._4_4_ = fStack_35c;
        auVar95._0_4_ = local_360;
        auVar95._8_4_ = fStack_358;
        auVar95._12_4_ = fStack_354;
        auVar95._16_4_ = fStack_350;
        auVar95._20_4_ = fStack_34c;
        auVar95._24_4_ = fStack_348;
        auVar95._28_4_ = fStack_344;
        auVar33 = vminps_avx(auVar95,auVar125);
        auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar173 + fVar146 * (auVar33._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar199 + fVar170 * (auVar33._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar200 + fVar171 * (auVar33._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar201 + fVar172 * (auVar33._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar173 + fVar146 * (auVar33._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar199 + fVar170 * (auVar33._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar200 + fVar171 * (auVar33._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar201 + auVar33._28_4_ + 7.0;
        auVar74._4_4_ = auVar35._4_4_ * 0.99999976;
        auVar74._0_4_ = auVar35._0_4_ * 0.99999976;
        auVar74._8_4_ = auVar35._8_4_ * 0.99999976;
        auVar74._12_4_ = auVar35._12_4_ * 0.99999976;
        auVar74._16_4_ = auVar35._16_4_ * 0.99999976;
        auVar74._20_4_ = auVar35._20_4_ * 0.99999976;
        auVar74._24_4_ = auVar35._24_4_ * 0.99999976;
        auVar74._28_4_ = 0x3f7ffffc;
        auVar33 = vmaxps_avx(ZEXT832(0) << 0x20,auVar74);
        auVar75._4_4_ = auVar33._4_4_ * auVar33._4_4_;
        auVar75._0_4_ = auVar33._0_4_ * auVar33._0_4_;
        auVar75._8_4_ = auVar33._8_4_ * auVar33._8_4_;
        auVar75._12_4_ = auVar33._12_4_ * auVar33._12_4_;
        auVar75._16_4_ = auVar33._16_4_ * auVar33._16_4_;
        auVar75._20_4_ = auVar33._20_4_ * auVar33._20_4_;
        auVar75._24_4_ = auVar33._24_4_ * auVar33._24_4_;
        auVar75._28_4_ = auVar33._28_4_;
        auVar35 = vsubps_avx(auVar38,auVar75);
        auVar76._4_4_ = auVar35._4_4_ * fVar134 * 4.0;
        auVar76._0_4_ = auVar35._0_4_ * fVar337 * 4.0;
        auVar76._8_4_ = auVar35._8_4_ * fVar136 * 4.0;
        auVar76._12_4_ = auVar35._12_4_ * fVar138 * 4.0;
        auVar76._16_4_ = auVar35._16_4_ * fStack_730;
        auVar76._20_4_ = auVar35._20_4_ * fStack_72c;
        auVar76._24_4_ = auVar35._24_4_ * fStack_728;
        auVar76._28_4_ = auVar33._28_4_;
        auVar215 = vsubps_avx(auVar58,auVar76);
        local_980 = vcmpps_avx(auVar215,ZEXT832(0) << 0x20,5);
        auVar33 = local_980;
        if ((((((((local_980 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_980 >> 0x7f,0) == '\0') &&
              (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_980 >> 0xbf,0) == '\0') &&
            (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_980[0x1f]) {
          auVar267 = ZEXT828(0) << 0x20;
          auVar242 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar297 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar353 = ZEXT864(0) << 0x20;
          _local_a80 = SUB3228(ZEXT432(0),0) << 0x20;
          auVar314._8_4_ = 0x7f800000;
          auVar314._0_8_ = 0x7f8000007f800000;
          auVar314._12_4_ = 0x7f800000;
          auVar314._16_4_ = 0x7f800000;
          auVar314._20_4_ = 0x7f800000;
          auVar314._24_4_ = 0x7f800000;
          auVar314._28_4_ = 0x7f800000;
          auVar364._8_4_ = 0xff800000;
          auVar364._0_8_ = 0xff800000ff800000;
          auVar364._12_4_ = 0xff800000;
          auVar364._16_4_ = 0xff800000;
          auVar364._20_4_ = 0xff800000;
          auVar364._24_4_ = 0xff800000;
          auVar364._28_4_ = 0xff800000;
          local_980 = auVar41;
        }
        else {
          auVar243 = vrcpps_avx(local_320);
          fVar337 = auVar243._0_4_;
          auVar228._0_4_ = local_320._0_4_ * fVar337;
          fVar270 = auVar243._4_4_;
          auVar228._4_4_ = local_320._4_4_ * fVar270;
          fVar274 = auVar243._8_4_;
          auVar228._8_4_ = local_320._8_4_ * fVar274;
          fVar278 = auVar243._12_4_;
          auVar228._12_4_ = local_320._12_4_ * fVar278;
          fVar233 = auVar243._16_4_;
          auVar228._16_4_ = local_320._16_4_ * fVar233;
          fVar254 = auVar243._20_4_;
          auVar228._20_4_ = local_320._20_4_ * fVar254;
          fVar255 = auVar243._24_4_;
          auVar228._24_4_ = local_320._24_4_ * fVar255;
          auVar228._28_4_ = 0;
          auVar36 = vsubps_avx(auVar125,auVar228);
          auVar31 = vsqrtps_avx(auVar215);
          fVar337 = fVar337 + fVar337 * auVar36._0_4_;
          fVar270 = fVar270 + fVar270 * auVar36._4_4_;
          fVar274 = fVar274 + fVar274 * auVar36._8_4_;
          fVar278 = fVar278 + fVar278 * auVar36._12_4_;
          fVar233 = fVar233 + fVar233 * auVar36._16_4_;
          fVar254 = fVar254 + fVar254 * auVar36._20_4_;
          fVar255 = fVar255 + fVar255 * auVar36._24_4_;
          auVar37 = vsubps_avx(local_9c0,auVar31);
          fVar299 = auVar37._0_4_ * fVar337;
          fVar301 = auVar37._4_4_ * fVar270;
          auVar77._4_4_ = fVar301;
          auVar77._0_4_ = fVar299;
          fVar303 = auVar37._8_4_ * fVar274;
          auVar77._8_4_ = fVar303;
          fVar316 = auVar37._12_4_ * fVar278;
          auVar77._12_4_ = fVar316;
          fVar319 = auVar37._16_4_ * fVar233;
          auVar77._16_4_ = fVar319;
          fVar322 = auVar37._20_4_ * fVar254;
          auVar77._20_4_ = fVar322;
          fVar325 = auVar37._24_4_ * fVar255;
          auVar77._24_4_ = fVar325;
          auVar77._28_4_ = fVar407;
          auVar37 = vsubps_avx(auVar31,local_400);
          fVar337 = auVar37._0_4_ * fVar337;
          fVar270 = auVar37._4_4_ * fVar270;
          auVar78._4_4_ = fVar270;
          auVar78._0_4_ = fVar337;
          fVar274 = auVar37._8_4_ * fVar274;
          auVar78._8_4_ = fVar274;
          fVar278 = auVar37._12_4_ * fVar278;
          auVar78._12_4_ = fVar278;
          fVar233 = auVar37._16_4_ * fVar233;
          auVar78._16_4_ = fVar233;
          fVar254 = auVar37._20_4_ * fVar254;
          auVar78._20_4_ = fVar254;
          fVar255 = auVar37._24_4_ * fVar255;
          auVar78._24_4_ = fVar255;
          auVar78._28_4_ = 0x7f800000;
          fVar271 = fVar252 * (fVar299 * local_660 + local_680._0_4_);
          fVar256 = fVar272 * (fVar301 * fStack_65c + local_680._4_4_);
          fVar279 = fVar285 * (fVar303 * fStack_658 + local_680._8_4_);
          fVar280 = fVar304 * (fVar316 * fStack_654 + local_680._12_4_);
          fVar282 = fVar328 * (fVar319 * fStack_650 + local_680._16_4_);
          fVar283 = fVar257 * (fVar322 * fStack_64c + local_680._20_4_);
          fVar292 = fVar259 * (fVar325 * fStack_648 + local_680._24_4_);
          auVar127._0_4_ = local_9a0 + fVar271 * fVar261;
          auVar127._4_4_ = fStack_99c + fVar256 * fVar360;
          auVar127._8_4_ = fStack_998 + fVar279 * fVar276;
          auVar127._12_4_ = fStack_994 + fVar280 * fVar289;
          auVar127._16_4_ = fStack_990 + fVar282 * fVar307;
          auVar127._20_4_ = fStack_98c + fVar283 * fVar348;
          auVar127._24_4_ = fStack_988 + fVar292 * fVar21;
          auVar127._28_4_ = fStack_984 + auVar243._28_4_ + auVar36._28_4_ + local_680._28_4_;
          auVar79._4_4_ = (float)local_920._4_4_ * fVar301;
          auVar79._0_4_ = (float)local_920._0_4_ * fVar299;
          auVar79._8_4_ = fStack_918 * fVar303;
          auVar79._12_4_ = fStack_914 * fVar316;
          auVar79._16_4_ = fStack_910 * fVar319;
          auVar79._20_4_ = fStack_90c * fVar322;
          auVar79._24_4_ = fStack_908 * fVar325;
          auVar79._28_4_ = auVar31._28_4_;
          auVar36 = vsubps_avx(auVar79,auVar127);
          auVar247._0_4_ = fVar308 + fVar298 * fVar271;
          auVar247._4_4_ = fVar317 + fVar253 * fVar256;
          auVar247._8_4_ = fVar320 + fVar275 * fVar279;
          auVar247._12_4_ = fVar323 + fVar286 * fVar280;
          auVar247._16_4_ = fVar326 + fVar305 * fVar282;
          auVar247._20_4_ = fVar329 + fVar331 * fVar283;
          auVar247._24_4_ = fVar332 + fVar19 * fVar292;
          auVar247._28_4_ = fVar335 + auVar31._28_4_;
          auVar80._4_4_ = (float)local_760._4_4_ * fVar301;
          auVar80._0_4_ = (float)local_760._0_4_ * fVar299;
          auVar80._8_4_ = fStack_758 * fVar303;
          auVar80._12_4_ = fStack_754 * fVar316;
          auVar80._16_4_ = fStack_750 * fVar319;
          auVar80._20_4_ = fStack_74c * fVar322;
          auVar80._24_4_ = fStack_748 * fVar325;
          auVar80._28_4_ = 0x3e000000;
          local_a20 = vsubps_avx(auVar80,auVar247);
          auVar229._0_4_ = fVar309 + fVar347 * fVar271;
          auVar229._4_4_ = fVar318 + fVar262 * fVar256;
          auVar229._8_4_ = fVar321 + fVar258 * fVar279;
          auVar229._12_4_ = fVar324 + fVar288 * fVar280;
          auVar229._16_4_ = fVar327 + fVar306 * fVar282;
          auVar229._20_4_ = fVar330 + fVar334 * fVar283;
          auVar229._24_4_ = fVar333 + fVar20 * fVar292;
          auVar229._28_4_ = fVar336 + auVar37._28_4_;
          auVar81._4_4_ = fVar301 * (float)local_780._4_4_;
          auVar81._0_4_ = fVar299 * (float)local_780._0_4_;
          auVar81._8_4_ = fVar303 * fStack_778;
          auVar81._12_4_ = fVar316 * fStack_774;
          auVar81._16_4_ = fVar319 * fStack_770;
          auVar81._20_4_ = fVar322 * fStack_76c;
          auVar81._24_4_ = fVar325 * fStack_768;
          auVar81._28_4_ = auVar247._28_4_;
          auVar243 = vsubps_avx(auVar81,auVar229);
          _local_a80 = auVar243._0_28_;
          fVar252 = fVar252 * (fVar337 * local_660 + local_680._0_4_);
          fVar272 = fVar272 * (fVar270 * fStack_65c + local_680._4_4_);
          fVar285 = fVar285 * (fVar274 * fStack_658 + local_680._8_4_);
          fVar304 = fVar304 * (fVar278 * fStack_654 + local_680._12_4_);
          fVar328 = fVar328 * (fVar233 * fStack_650 + local_680._16_4_);
          fVar257 = fVar257 * (fVar254 * fStack_64c + local_680._20_4_);
          fVar259 = fVar259 * (fVar255 * fStack_648 + local_680._24_4_);
          auVar230._0_4_ = local_9a0 + fVar252 * fVar261;
          auVar230._4_4_ = fStack_99c + fVar272 * fVar360;
          auVar230._8_4_ = fStack_998 + fVar285 * fVar276;
          auVar230._12_4_ = fStack_994 + fVar304 * fVar289;
          auVar230._16_4_ = fStack_990 + fVar328 * fVar307;
          auVar230._20_4_ = fStack_98c + fVar257 * fVar348;
          auVar230._24_4_ = fStack_988 + fVar259 * fVar21;
          auVar230._28_4_ = fStack_984 + auVar243._28_4_ + local_680._28_4_;
          auVar82._4_4_ = (float)local_920._4_4_ * fVar270;
          auVar82._0_4_ = (float)local_920._0_4_ * fVar337;
          auVar82._8_4_ = fStack_918 * fVar274;
          auVar82._12_4_ = fStack_914 * fVar278;
          auVar82._16_4_ = fStack_910 * fVar233;
          auVar82._20_4_ = fStack_90c * fVar254;
          auVar82._24_4_ = fStack_908 * fVar255;
          auVar82._28_4_ = 0x3e000000;
          auVar243 = vsubps_avx(auVar82,auVar230);
          auVar225 = auVar243._0_28_;
          auVar268._0_4_ = fVar308 + fVar298 * fVar252;
          auVar268._4_4_ = fVar317 + fVar253 * fVar272;
          auVar268._8_4_ = fVar320 + fVar275 * fVar285;
          auVar268._12_4_ = fVar323 + fVar286 * fVar304;
          auVar268._16_4_ = fVar326 + fVar305 * fVar328;
          auVar268._20_4_ = fVar329 + fVar331 * fVar257;
          auVar268._24_4_ = fVar332 + fVar19 * fVar259;
          auVar268._28_4_ = fVar335 + 0.125;
          auVar83._4_4_ = (float)local_760._4_4_ * fVar270;
          auVar83._0_4_ = (float)local_760._0_4_ * fVar337;
          auVar83._8_4_ = fStack_758 * fVar274;
          auVar83._12_4_ = fStack_754 * fVar278;
          auVar83._16_4_ = fStack_750 * fVar233;
          auVar83._20_4_ = fStack_74c * fVar254;
          auVar83._24_4_ = fStack_748 * fVar255;
          auVar83._28_4_ = fStack_904;
          auVar243 = vsubps_avx(auVar83,auVar268);
          auVar267 = auVar243._0_28_;
          auVar248._0_4_ = fVar309 + fVar347 * fVar252;
          auVar248._4_4_ = fVar318 + fVar262 * fVar272;
          auVar248._8_4_ = fVar321 + fVar258 * fVar285;
          auVar248._12_4_ = fVar324 + fVar288 * fVar304;
          auVar248._16_4_ = fVar327 + fVar306 * fVar328;
          auVar248._20_4_ = fVar330 + fVar334 * fVar257;
          auVar248._24_4_ = fVar333 + fVar20 * fVar259;
          auVar248._28_4_ = fVar336 + auVar247._28_4_;
          auVar84._4_4_ = fVar270 * (float)local_780._4_4_;
          auVar84._0_4_ = fVar337 * (float)local_780._0_4_;
          auVar84._8_4_ = fVar274 * fStack_778;
          auVar84._12_4_ = fVar278 * fStack_774;
          auVar84._16_4_ = fVar233 * fStack_770;
          auVar84._20_4_ = fVar254 * fStack_76c;
          auVar84._24_4_ = fVar255 * fStack_768;
          auVar84._28_4_ = fStack_904;
          auVar243 = vsubps_avx(auVar84,auVar248);
          auVar242 = auVar243._0_28_;
          auVar215 = vcmpps_avx(auVar215,_DAT_01f7b000,5);
          auVar315._8_4_ = 0x7f800000;
          auVar315._0_8_ = 0x7f8000007f800000;
          auVar315._12_4_ = 0x7f800000;
          auVar315._16_4_ = 0x7f800000;
          auVar315._20_4_ = 0x7f800000;
          auVar315._24_4_ = 0x7f800000;
          auVar315._28_4_ = 0x7f800000;
          auVar314 = vblendvps_avx(auVar315,auVar77,auVar215);
          auVar243 = vmaxps_avx(local_640,local_3c0);
          auVar85._4_4_ = auVar243._4_4_ * 1.9073486e-06;
          auVar85._0_4_ = auVar243._0_4_ * 1.9073486e-06;
          auVar85._8_4_ = auVar243._8_4_ * 1.9073486e-06;
          auVar85._12_4_ = auVar243._12_4_ * 1.9073486e-06;
          auVar85._16_4_ = auVar243._16_4_ * 1.9073486e-06;
          auVar85._20_4_ = auVar243._20_4_ * 1.9073486e-06;
          auVar85._24_4_ = auVar243._24_4_ * 1.9073486e-06;
          auVar85._28_4_ = auVar243._28_4_;
          auVar243 = vcmpps_avx(local_3e0,auVar85,1);
          auVar365._8_4_ = 0xff800000;
          auVar365._0_8_ = 0xff800000ff800000;
          auVar365._12_4_ = 0xff800000;
          auVar365._16_4_ = 0xff800000;
          auVar365._20_4_ = 0xff800000;
          auVar365._24_4_ = 0xff800000;
          auVar365._28_4_ = 0xff800000;
          auVar364 = vblendvps_avx(auVar365,auVar78,auVar215);
          auVar31 = auVar215 & auVar243;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar33 = vandps_avx(auVar243,auVar215);
            auVar237 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
            auVar34 = vcmpps_avx(auVar35,_DAT_01f7b000,2);
            auVar132._8_4_ = 0xff800000;
            auVar132._0_8_ = 0xff800000ff800000;
            auVar132._12_4_ = 0xff800000;
            auVar132._16_4_ = 0xff800000;
            auVar132._20_4_ = 0xff800000;
            auVar132._24_4_ = 0xff800000;
            auVar132._28_4_ = 0xff800000;
            auVar198._8_4_ = 0x7f800000;
            auVar198._0_8_ = 0x7f8000007f800000;
            auVar198._12_4_ = 0x7f800000;
            auVar198._16_4_ = 0x7f800000;
            auVar198._20_4_ = 0x7f800000;
            auVar198._24_4_ = 0x7f800000;
            auVar198._28_4_ = 0x7f800000;
            auVar35 = vblendvps_avx(auVar198,auVar132,auVar34);
            auVar189 = vpmovsxwd_avx(auVar237);
            auVar237 = vpunpckhwd_avx(auVar237,auVar237);
            auVar403._16_16_ = auVar237;
            auVar403._0_16_ = auVar189;
            auVar314 = vblendvps_avx(auVar314,auVar35,auVar403);
            auVar35 = vblendvps_avx(auVar132,auVar198,auVar34);
            auVar364 = vblendvps_avx(auVar364,auVar35,auVar403);
            auVar218._0_8_ = auVar33._0_8_ ^ 0xffffffffffffffff;
            auVar218._8_4_ = auVar33._8_4_ ^ 0xffffffff;
            auVar218._12_4_ = auVar33._12_4_ ^ 0xffffffff;
            auVar218._16_4_ = auVar33._16_4_ ^ 0xffffffff;
            auVar218._20_4_ = auVar33._20_4_ ^ 0xffffffff;
            auVar218._24_4_ = auVar33._24_4_ ^ 0xffffffff;
            auVar218._28_4_ = auVar33._28_4_ ^ 0xffffffff;
            auVar33 = vorps_avx(auVar34,auVar218);
            auVar33 = vandps_avx(auVar215,auVar33);
          }
          auVar378 = ZEXT3264(auVar34);
          auVar297 = ZEXT3264(auVar36);
          auVar353 = ZEXT3264(local_a20);
        }
        auVar366 = ZEXT3264(auVar364);
        _local_4a0 = local_7a0;
        local_480 = vminps_avx(local_440,auVar314);
        auVar35 = vmaxps_avx(local_7a0,auVar364);
        _local_460 = auVar35;
        auVar34 = vcmpps_avx(local_7a0,local_480,2);
        local_6c0 = vandps_avx(auVar34,auVar122);
        auVar34 = vcmpps_avx(auVar35,local_440,2);
        auVar122 = vandps_avx(auVar122,auVar34);
        auVar34 = vorps_avx(auVar122,local_6c0);
        if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar34 >> 0x7f,0) == '\0') &&
              (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar34 >> 0xbf,0) == '\0') &&
            (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar34[0x1f]) {
          auVar344 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
        else {
          auVar366 = ZEXT3264(_local_780);
          auVar194._0_8_ = auVar33._0_8_ ^ 0xffffffffffffffff;
          auVar194._8_4_ = auVar33._8_4_ ^ 0xffffffff;
          auVar194._12_4_ = auVar33._12_4_ ^ 0xffffffff;
          auVar194._16_4_ = auVar33._16_4_ ^ 0xffffffff;
          auVar194._20_4_ = auVar33._20_4_ ^ 0xffffffff;
          auVar194._24_4_ = auVar33._24_4_ ^ 0xffffffff;
          fVar337 = auVar33._28_4_;
          auVar194._28_4_ = (uint)fVar337 ^ 0xffffffff;
          auVar162._0_4_ =
               (float)local_920._0_4_ * auVar225._0_4_ +
               (float)local_760._0_4_ * auVar267._0_4_ + (float)local_780._0_4_ * auVar242._0_4_;
          auVar162._4_4_ =
               (float)local_920._4_4_ * auVar225._4_4_ +
               (float)local_760._4_4_ * auVar267._4_4_ + (float)local_780._4_4_ * auVar242._4_4_;
          auVar162._8_4_ =
               fStack_918 * auVar225._8_4_ +
               fStack_758 * auVar267._8_4_ + fStack_778 * auVar242._8_4_;
          auVar162._12_4_ =
               fStack_914 * auVar225._12_4_ +
               fStack_754 * auVar267._12_4_ + fStack_774 * auVar242._12_4_;
          auVar162._16_4_ =
               fStack_910 * auVar225._16_4_ +
               fStack_750 * auVar267._16_4_ + fStack_770 * auVar242._16_4_;
          auVar162._20_4_ =
               fStack_90c * auVar225._20_4_ +
               fStack_74c * auVar267._20_4_ + fStack_76c * auVar242._20_4_;
          auVar162._24_4_ =
               fStack_908 * auVar225._24_4_ +
               fStack_748 * auVar267._24_4_ + fStack_768 * auVar242._24_4_;
          auVar162._28_4_ = fVar337 + auVar122._28_4_ + auVar34._28_4_;
          auVar231._8_4_ = 0x7fffffff;
          auVar231._0_8_ = 0x7fffffff7fffffff;
          auVar231._12_4_ = 0x7fffffff;
          auVar231._16_4_ = 0x7fffffff;
          auVar231._20_4_ = 0x7fffffff;
          auVar231._24_4_ = 0x7fffffff;
          auVar231._28_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar162,auVar231);
          auVar249._8_4_ = 0x3e99999a;
          auVar249._0_8_ = 0x3e99999a3e99999a;
          auVar249._12_4_ = 0x3e99999a;
          auVar249._16_4_ = 0x3e99999a;
          auVar249._20_4_ = 0x3e99999a;
          auVar249._24_4_ = 0x3e99999a;
          auVar249._28_4_ = 0x3e99999a;
          auVar34 = vcmpps_avx(auVar34,auVar249,1);
          local_700 = vorps_avx(auVar34,auVar194);
          auVar378 = ZEXT3264(local_6c0);
          auVar128._0_4_ =
               (float)local_920._0_4_ * auVar297._0_4_ +
               (float)local_760._0_4_ * auVar353._0_4_ +
               (float)local_780._0_4_ * (float)local_a80._0_4_;
          auVar128._4_4_ =
               (float)local_920._4_4_ * auVar297._4_4_ +
               (float)local_760._4_4_ * auVar353._4_4_ +
               (float)local_780._4_4_ * (float)local_a80._4_4_;
          auVar128._8_4_ =
               fStack_918 * auVar297._8_4_ + fStack_758 * auVar353._8_4_ + fStack_778 * fStack_a78;
          auVar128._12_4_ =
               fStack_914 * auVar297._12_4_ + fStack_754 * auVar353._12_4_ + fStack_774 * fStack_a74
          ;
          auVar128._16_4_ =
               fStack_910 * auVar297._16_4_ + fStack_750 * auVar353._16_4_ + fStack_770 * fStack_a70
          ;
          auVar128._20_4_ =
               fStack_90c * auVar297._20_4_ + fStack_74c * auVar353._20_4_ + fStack_76c * fStack_a6c
          ;
          auVar128._24_4_ =
               fStack_908 * auVar297._24_4_ + fStack_748 * auVar353._24_4_ + fStack_768 * fStack_a68
          ;
          auVar128._28_4_ = local_6c0._28_4_ + local_700._28_4_ + fVar337;
          auVar34 = vandps_avx(auVar128,auVar231);
          auVar34 = vcmpps_avx(auVar34,auVar249,1);
          auVar34 = vorps_avx(auVar34,auVar194);
          auVar163._8_4_ = 3;
          auVar163._0_8_ = 0x300000003;
          auVar163._12_4_ = 3;
          auVar163._16_4_ = 3;
          auVar163._20_4_ = 3;
          auVar163._24_4_ = 3;
          auVar163._28_4_ = 3;
          auVar195._8_4_ = 2;
          auVar195._0_8_ = 0x200000002;
          auVar195._12_4_ = 2;
          auVar195._16_4_ = 2;
          auVar195._20_4_ = 2;
          auVar195._24_4_ = 2;
          auVar195._28_4_ = 2;
          auVar34 = vblendvps_avx(auVar195,auVar163,auVar34);
          local_720 = ZEXT432(local_c88);
          local_740 = vpshufd_avx(ZEXT416(local_c88),0);
          auVar237 = vpcmpgtd_avx(auVar34._16_16_,local_740);
          auVar189 = vpcmpgtd_avx(auVar34._0_16_,local_740);
          auVar164._16_16_ = auVar237;
          auVar164._0_16_ = auVar189;
          local_6e0 = vblendps_avx(ZEXT1632(auVar189),auVar164,0xf0);
          local_4c0 = vandnps_avx(local_6e0,local_6c0);
          local_8e0._4_4_ = local_7a0._4_4_ + fVar300;
          local_8e0._0_4_ = local_7a0._0_4_ + fVar345;
          fStack_8d8 = local_7a0._8_4_ + fVar346;
          fStack_8d4 = local_7a0._12_4_ + fVar302;
          fStack_8d0 = local_7a0._16_4_ + fVar345;
          fStack_8cc = local_7a0._20_4_ + fVar300;
          fStack_8c8 = local_7a0._24_4_ + fVar346;
          fStack_8c4 = local_7a0._28_4_ + fVar302;
          while( true ) {
            local_be0._0_4_ = auVar17._0_4_;
            local_be0._4_4_ = auVar17._4_4_;
            fStack_bd8 = auVar17._8_4_;
            fStack_bd4 = auVar17._12_4_;
            local_c30 = auVar29._0_4_;
            fStack_c2c = auVar29._4_4_;
            fStack_c28 = auVar29._8_4_;
            fStack_c24 = auVar29._12_4_;
            local_bd0 = auVar30._0_4_;
            fStack_bcc = auVar30._4_4_;
            fStack_bc8 = auVar30._8_4_;
            fStack_bc4 = auVar30._12_4_;
            local_bf0._0_4_ = auVar28._0_4_;
            local_bf0._4_4_ = auVar28._4_4_;
            fStack_be8 = auVar28._8_4_;
            fStack_be4 = auVar28._12_4_;
            if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_4c0 >> 0x7f,0) == '\0') &&
                  (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_4c0 >> 0xbf,0) == '\0') &&
                (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_4c0[0x1f]) break;
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar34 = vblendvps_avx(auVar165,local_7a0,local_4c0);
            auVar33 = vshufps_avx(auVar34,auVar34,0xb1);
            auVar33 = vminps_avx(auVar34,auVar33);
            auVar215 = vshufpd_avx(auVar33,auVar33,5);
            auVar33 = vminps_avx(auVar33,auVar215);
            auVar215 = vperm2f128_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar33,auVar215);
            auVar33 = vcmpps_avx(auVar34,auVar33,0);
            auVar215 = local_4c0 & auVar33;
            auVar34 = local_4c0;
            if ((((((((auVar215 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar215 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar215 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar215 >> 0x7f,0) != '\0') ||
                  (auVar215 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar215 >> 0xbf,0) != '\0') ||
                (auVar215 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar215[0x1f] < '\0') {
              auVar34 = vandps_avx(auVar33,local_4c0);
            }
            uVar96 = vmovmskps_avx(auVar34);
            uVar105 = 0;
            if (uVar96 != 0) {
              for (; (uVar96 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
              }
            }
            uVar98 = (ulong)uVar105;
            *(undefined4 *)(local_4c0 + uVar98 * 4) = 0;
            fVar337 = local_1a0[uVar98];
            uVar105 = *(uint *)(local_4a0 + uVar98 * 4);
            fVar298 = auVar150._0_4_;
            if ((float)local_9d0._0_4_ < 0.0) {
              auVar353 = ZEXT1664(auVar353._0_16_);
              auVar366 = ZEXT1664(auVar366._0_16_);
              auVar378 = ZEXT1664(auVar378._0_16_);
              fVar298 = sqrtf((float)local_9d0._0_4_);
              uVar98 = extraout_RAX;
            }
            auVar297 = ZEXT464(uVar105);
            auVar189 = vminps_avx(auVar28,auVar30);
            auVar237 = vmaxps_avx(auVar28,auVar30);
            auVar179 = vminps_avx(auVar29,auVar17);
            auVar113 = vminps_avx(auVar189,auVar179);
            auVar189 = vmaxps_avx(auVar29,auVar17);
            auVar179 = vmaxps_avx(auVar237,auVar189);
            auVar205._8_4_ = 0x7fffffff;
            auVar205._0_8_ = 0x7fffffff7fffffff;
            auVar205._12_4_ = 0x7fffffff;
            auVar237 = vandps_avx(auVar113,auVar205);
            auVar189 = vandps_avx(auVar179,auVar205);
            auVar237 = vmaxps_avx(auVar237,auVar189);
            auVar189 = vmovshdup_avx(auVar237);
            auVar189 = vmaxss_avx(auVar189,auVar237);
            auVar237 = vshufpd_avx(auVar237,auVar237,1);
            auVar237 = vmaxss_avx(auVar237,auVar189);
            fVar347 = auVar237._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar298 * 1.9073486e-06;
            local_9c0._0_16_ = vshufps_avx(auVar179,auVar179,0xff);
            auVar237 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar337),0x10);
            for (uVar104 = 0; bVar107 = (byte)uVar98, uVar104 != 5; uVar104 = uVar104 + 1) {
              auVar189 = vmovshdup_avx(auVar237);
              fVar337 = auVar189._0_4_;
              fVar274 = 1.0 - fVar337;
              fVar298 = fVar274 * fVar274 * fVar274;
              fVar261 = fVar337 * fVar337 * fVar337;
              fVar270 = fVar337 * fVar274;
              auVar189 = vshufps_avx(ZEXT416((uint)(fVar261 * 0.16666667)),
                                     ZEXT416((uint)(fVar261 * 0.16666667)),0);
              auVar179 = ZEXT416((uint)((fVar261 * 4.0 + fVar298 +
                                        fVar337 * fVar270 * 12.0 + fVar274 * fVar270 * 6.0) *
                                       0.16666667));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar113 = ZEXT416((uint)((fVar298 * 4.0 + fVar261 +
                                        fVar274 * fVar270 * 12.0 + fVar337 * fVar270 * 6.0) *
                                       0.16666667));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar109 = vshufps_avx(auVar237,auVar237,0);
              auVar180._0_4_ = auVar109._0_4_ * fVar108 + 0.0;
              auVar180._4_4_ = auVar109._4_4_ * fVar133 + 0.0;
              auVar180._8_4_ = auVar109._8_4_ * fVar135 + 0.0;
              auVar180._12_4_ = auVar109._12_4_ * fVar137 + 0.0;
              auVar109 = vshufps_avx(ZEXT416((uint)(fVar298 * 0.16666667)),
                                     ZEXT416((uint)(fVar298 * 0.16666667)),0);
              auVar111._0_4_ =
                   auVar109._0_4_ * (float)local_bf0._0_4_ +
                   auVar113._0_4_ * local_bd0 +
                   auVar189._0_4_ * (float)local_be0._0_4_ + auVar179._0_4_ * local_c30;
              auVar111._4_4_ =
                   auVar109._4_4_ * (float)local_bf0._4_4_ +
                   auVar113._4_4_ * fStack_bcc +
                   auVar189._4_4_ * (float)local_be0._4_4_ + auVar179._4_4_ * fStack_c2c;
              auVar111._8_4_ =
                   auVar109._8_4_ * fStack_be8 +
                   auVar113._8_4_ * fStack_bc8 +
                   auVar189._8_4_ * fStack_bd8 + auVar179._8_4_ * fStack_c28;
              auVar111._12_4_ =
                   auVar109._12_4_ * fStack_be4 +
                   auVar113._12_4_ * fStack_bc4 +
                   auVar189._12_4_ * fStack_bd4 + auVar179._12_4_ * fStack_c24;
              local_a20._0_16_ = auVar111;
              auVar189 = vsubps_avx(auVar180,auVar111);
              local_9a0 = auVar189._0_4_;
              fStack_99c = auVar189._4_4_;
              fStack_998 = auVar189._8_4_;
              fStack_994 = auVar189._12_4_;
              auVar189 = vdpps_avx(auVar189,auVar189,0x7f);
              fVar298 = auVar189._0_4_;
              if (fVar298 < 0.0) {
                fVar261 = sqrtf(fVar298);
                uVar98 = extraout_RAX_00;
              }
              else {
                auVar179 = vsqrtss_avx(auVar189,auVar189);
                fVar261 = auVar179._0_4_;
              }
              auVar179 = ZEXT416((uint)(fVar337 * fVar337 * 0.5));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar113 = ZEXT416((uint)((fVar274 * fVar274 + fVar270 * 4.0) * 0.5));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar109 = ZEXT416((uint)((fVar337 * -fVar337 - fVar270 * 4.0) * 0.5));
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              auVar112 = ZEXT416((uint)(fVar274 * -fVar274 * 0.5));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar312._0_4_ =
                   (float)local_bf0._0_4_ * auVar112._0_4_ +
                   local_bd0 * auVar109._0_4_ +
                   (float)local_be0._0_4_ * auVar179._0_4_ + local_c30 * auVar113._0_4_;
              auVar312._4_4_ =
                   (float)local_bf0._4_4_ * auVar112._4_4_ +
                   fStack_bcc * auVar109._4_4_ +
                   (float)local_be0._4_4_ * auVar179._4_4_ + fStack_c2c * auVar113._4_4_;
              auVar312._8_4_ =
                   fStack_be8 * auVar112._8_4_ +
                   fStack_bc8 * auVar109._8_4_ +
                   fStack_bd8 * auVar179._8_4_ + fStack_c28 * auVar113._8_4_;
              auVar312._12_4_ =
                   fStack_be4 * auVar112._12_4_ +
                   fStack_bc4 * auVar109._12_4_ +
                   fStack_bd4 * auVar179._12_4_ + fStack_c24 * auVar113._12_4_;
              auVar179 = vshufps_avx(auVar237,auVar237,0x55);
              auVar113 = ZEXT416((uint)(fVar274 - (fVar337 + fVar337)));
              auVar109 = vshufps_avx(auVar113,auVar113,0);
              auVar113 = ZEXT416((uint)(fVar337 - (fVar274 + fVar274)));
              auVar112 = vshufps_avx(auVar113,auVar113,0);
              auVar148 = vshufps_avx(ZEXT416((uint)fVar274),ZEXT416((uint)fVar274),0);
              auVar113 = vdpps_avx(auVar312,auVar312,0x7f);
              auVar151._0_4_ =
                   (float)local_bf0._0_4_ * auVar148._0_4_ +
                   local_bd0 * auVar112._0_4_ +
                   (float)local_be0._0_4_ * auVar179._0_4_ + local_c30 * auVar109._0_4_;
              auVar151._4_4_ =
                   (float)local_bf0._4_4_ * auVar148._4_4_ +
                   fStack_bcc * auVar112._4_4_ +
                   (float)local_be0._4_4_ * auVar179._4_4_ + fStack_c2c * auVar109._4_4_;
              auVar151._8_4_ =
                   fStack_be8 * auVar148._8_4_ +
                   fStack_bc8 * auVar112._8_4_ +
                   fStack_bd8 * auVar179._8_4_ + fStack_c28 * auVar109._8_4_;
              auVar151._12_4_ =
                   fStack_be4 * auVar148._12_4_ +
                   fStack_bc4 * auVar112._12_4_ +
                   fStack_bd4 * auVar179._12_4_ + fStack_c24 * auVar109._12_4_;
              auVar179 = vblendps_avx(auVar113,_DAT_01f45a50,0xe);
              auVar109 = vrsqrtss_avx(auVar179,auVar179);
              fVar270 = auVar109._0_4_;
              fVar337 = auVar113._0_4_;
              auVar109 = vdpps_avx(auVar312,auVar151,0x7f);
              auVar112 = vshufps_avx(auVar113,auVar113,0);
              auVar152._0_4_ = auVar151._0_4_ * auVar112._0_4_;
              auVar152._4_4_ = auVar151._4_4_ * auVar112._4_4_;
              auVar152._8_4_ = auVar151._8_4_ * auVar112._8_4_;
              auVar152._12_4_ = auVar151._12_4_ * auVar112._12_4_;
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              auVar221._0_4_ = auVar312._0_4_ * auVar109._0_4_;
              auVar221._4_4_ = auVar312._4_4_ * auVar109._4_4_;
              auVar221._8_4_ = auVar312._8_4_ * auVar109._8_4_;
              auVar221._12_4_ = auVar312._12_4_ * auVar109._12_4_;
              auVar148 = vsubps_avx(auVar152,auVar221);
              auVar109 = vrcpss_avx(auVar179,auVar179);
              auVar179 = vmaxss_avx(ZEXT416((uint)fVar347),
                                    ZEXT416((uint)(auVar237._0_4_ * (float)local_980._0_4_)));
              auVar353 = ZEXT1664(auVar179);
              auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - fVar337 * auVar109._0_4_)));
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              uVar86 = CONCAT44(auVar312._4_4_,auVar312._0_4_);
              auVar238._0_8_ = uVar86 ^ 0x8000000080000000;
              auVar238._8_4_ = -auVar312._8_4_;
              auVar238._12_4_ = -auVar312._12_4_;
              auVar112 = ZEXT416((uint)(fVar270 * 1.5 + fVar337 * -0.5 * fVar270 * fVar270 * fVar270
                                       ));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar206._0_4_ = auVar112._0_4_ * auVar148._0_4_ * auVar109._0_4_;
              auVar206._4_4_ = auVar112._4_4_ * auVar148._4_4_ * auVar109._4_4_;
              auVar206._8_4_ = auVar112._8_4_ * auVar148._8_4_ * auVar109._8_4_;
              auVar206._12_4_ = auVar112._12_4_ * auVar148._12_4_ * auVar109._12_4_;
              auVar265._0_4_ = auVar312._0_4_ * auVar112._0_4_;
              auVar265._4_4_ = auVar312._4_4_ * auVar112._4_4_;
              auVar265._8_4_ = auVar312._8_4_ * auVar112._8_4_;
              auVar265._12_4_ = auVar312._12_4_ * auVar112._12_4_;
              if (fVar337 < 0.0) {
                local_a00._0_16_ = auVar206;
                fVar337 = sqrtf(fVar337);
                auVar353 = ZEXT464(auVar179._0_4_);
                uVar98 = extraout_RAX_01;
                auVar206 = local_a00._0_16_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                fVar337 = auVar113._0_4_;
              }
              auVar91._4_4_ = fStack_99c;
              auVar91._0_4_ = local_9a0;
              auVar91._8_4_ = fStack_998;
              auVar91._12_4_ = fStack_994;
              auVar113 = vdpps_avx(auVar91,auVar265,0x7f);
              fVar337 = (fVar347 / fVar337) * (fVar261 + 1.0) + auVar353._0_4_ + fVar261 * fVar347;
              auVar109 = vdpps_avx(auVar238,auVar265,0x7f);
              auVar112 = vdpps_avx(auVar91,auVar206,0x7f);
              auVar148 = vdpps_avx(auVar26,auVar265,0x7f);
              auVar147 = vdpps_avx(auVar91,auVar238,0x7f);
              fVar261 = auVar109._0_4_ + auVar112._0_4_;
              fVar270 = auVar113._0_4_;
              auVar114._0_4_ = fVar270 * fVar270;
              auVar114._4_4_ = auVar113._4_4_ * auVar113._4_4_;
              auVar114._8_4_ = auVar113._8_4_ * auVar113._8_4_;
              auVar114._12_4_ = auVar113._12_4_ * auVar113._12_4_;
              auVar112 = vsubps_avx(auVar189,auVar114);
              auVar109 = vdpps_avx(auVar91,auVar26,0x7f);
              fVar274 = auVar147._0_4_ - fVar270 * fVar261;
              fVar278 = auVar109._0_4_ - fVar270 * auVar148._0_4_;
              auVar109 = vrsqrtss_avx(auVar112,auVar112);
              fVar233 = auVar112._0_4_;
              fVar270 = auVar109._0_4_;
              fVar270 = fVar270 * 1.5 + fVar233 * -0.5 * fVar270 * fVar270 * fVar270;
              if (fVar233 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)fVar261);
                local_880._0_4_ = fVar274;
                local_8a0._0_4_ = fVar278;
                local_8c0._0_4_ = fVar270;
                fVar233 = sqrtf(fVar233);
                auVar353 = ZEXT464(auVar179._0_4_);
                uVar98 = extraout_RAX_02;
                fVar270 = (float)local_8c0._0_4_;
                fVar274 = (float)local_880._0_4_;
                fVar278 = (float)local_8a0._0_4_;
                auVar179 = local_a00._0_16_;
              }
              else {
                auVar179 = vsqrtss_avx(auVar112,auVar112);
                fVar233 = auVar179._0_4_;
                auVar179 = ZEXT416((uint)fVar261);
              }
              auVar378 = ZEXT1664(auVar113);
              auVar366 = ZEXT464((uint)fVar337);
              auVar297 = ZEXT1664(auVar189);
              auVar153 = vpermilps_avx(local_a20._0_16_,0xff);
              auVar147 = vshufps_avx(auVar312,auVar312,0xff);
              fVar261 = fVar274 * fVar270 - auVar147._0_4_;
              auVar222._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar148._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar148._12_4_ ^ 0x80000000;
              auVar239._0_4_ = -fVar261;
              auVar239._4_4_ = 0x80000000;
              auVar239._8_4_ = 0x80000000;
              auVar239._12_4_ = 0x80000000;
              auVar109 = vinsertps_avx(auVar239,ZEXT416((uint)(fVar278 * fVar270)),0x1c);
              auVar112 = vmovsldup_avx(ZEXT416((uint)(auVar179._0_4_ * fVar278 * fVar270 -
                                                     auVar148._0_4_ * fVar261)));
              auVar109 = vdivps_avx(auVar109,auVar112);
              auVar179 = vinsertps_avx(auVar179,auVar222,0x10);
              auVar179 = vdivps_avx(auVar179,auVar112);
              auVar112 = vmovsldup_avx(auVar113);
              auVar153 = ZEXT416((uint)(fVar233 - auVar153._0_4_));
              auVar148 = vmovsldup_avx(auVar153);
              auVar181._0_4_ = auVar112._0_4_ * auVar109._0_4_ + auVar148._0_4_ * auVar179._0_4_;
              auVar181._4_4_ = auVar112._4_4_ * auVar109._4_4_ + auVar148._4_4_ * auVar179._4_4_;
              auVar181._8_4_ = auVar112._8_4_ * auVar109._8_4_ + auVar148._8_4_ * auVar179._8_4_;
              auVar181._12_4_ =
                   auVar112._12_4_ * auVar109._12_4_ + auVar148._12_4_ * auVar179._12_4_;
              auVar237 = vsubps_avx(auVar237,auVar181);
              auVar182._8_4_ = 0x7fffffff;
              auVar182._0_8_ = 0x7fffffff7fffffff;
              auVar182._12_4_ = 0x7fffffff;
              auVar179 = vandps_avx(auVar113,auVar182);
              if (auVar179._0_4_ < fVar337) {
                auVar207._8_4_ = 0x7fffffff;
                auVar207._0_8_ = 0x7fffffff7fffffff;
                auVar207._12_4_ = 0x7fffffff;
                auVar179 = vandps_avx(auVar153,auVar207);
                if (auVar179._0_4_ <
                    (float)local_9c0._0_4_ * 1.9073486e-06 + auVar353._0_4_ + fVar337) {
                  bVar106 = uVar104 < 5;
                  fVar347 = auVar237._0_4_ + (float)local_950._0_4_;
                  if (fVar347 < fVar291) {
                    bVar107 = 0;
                    goto LAB_008cc1db;
                  }
                  fVar261 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar347 <= fVar261) {
                    auVar179 = vmovshdup_avx(auVar237);
                    bVar107 = 0;
                    if ((auVar179._0_4_ < 0.0) || (1.0 < auVar179._0_4_)) goto LAB_008cc1db;
                    auVar179 = vrsqrtss_avx(auVar189,auVar189);
                    fVar270 = auVar179._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar101].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar107 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar179 = ZEXT416((uint)(fVar270 * 1.5 +
                                                 fVar298 * -0.5 * fVar270 * fVar270 * fVar270));
                        auVar179 = vshufps_avx(auVar179,auVar179,0);
                        auVar183._0_4_ = auVar179._0_4_ * local_9a0;
                        auVar183._4_4_ = auVar179._4_4_ * fStack_99c;
                        auVar183._8_4_ = auVar179._8_4_ * fStack_998;
                        auVar183._12_4_ = auVar179._12_4_ * fStack_994;
                        auVar115._0_4_ = auVar312._0_4_ + auVar147._0_4_ * auVar183._0_4_;
                        auVar115._4_4_ = auVar312._4_4_ + auVar147._4_4_ * auVar183._4_4_;
                        auVar115._8_4_ = auVar312._8_4_ + auVar147._8_4_ * auVar183._8_4_;
                        auVar115._12_4_ = auVar312._12_4_ + auVar147._12_4_ * auVar183._12_4_;
                        auVar179 = vshufps_avx(auVar183,auVar183,0xc9);
                        auVar109 = vshufps_avx(auVar312,auVar312,0xc9);
                        auVar184._0_4_ = auVar109._0_4_ * auVar183._0_4_;
                        auVar184._4_4_ = auVar109._4_4_ * auVar183._4_4_;
                        auVar184._8_4_ = auVar109._8_4_ * auVar183._8_4_;
                        auVar184._12_4_ = auVar109._12_4_ * auVar183._12_4_;
                        auVar208._0_4_ = auVar312._0_4_ * auVar179._0_4_;
                        auVar208._4_4_ = auVar312._4_4_ * auVar179._4_4_;
                        auVar208._8_4_ = auVar312._8_4_ * auVar179._8_4_;
                        auVar208._12_4_ = auVar312._12_4_ * auVar179._12_4_;
                        auVar112 = vsubps_avx(auVar208,auVar184);
                        auVar179 = vshufps_avx(auVar112,auVar112,0xc9);
                        auVar109 = vshufps_avx(auVar115,auVar115,0xc9);
                        auVar209._0_4_ = auVar109._0_4_ * auVar179._0_4_;
                        auVar209._4_4_ = auVar109._4_4_ * auVar179._4_4_;
                        auVar209._8_4_ = auVar109._8_4_ * auVar179._8_4_;
                        auVar209._12_4_ = auVar109._12_4_ * auVar179._12_4_;
                        auVar179 = vshufps_avx(auVar112,auVar112,0xd2);
                        auVar116._0_4_ = auVar115._0_4_ * auVar179._0_4_;
                        auVar116._4_4_ = auVar115._4_4_ * auVar179._4_4_;
                        auVar116._8_4_ = auVar115._8_4_ * auVar179._8_4_;
                        auVar116._12_4_ = auVar115._12_4_ * auVar179._12_4_;
                        auVar179 = vsubps_avx(auVar209,auVar116);
                        local_810 = vshufps_avx(auVar237,auVar237,0x55);
                        local_840 = (RTCHitN  [16])vshufps_avx(auVar179,auVar179,0x55);
                        auStack_830 = vshufps_avx(auVar179,auVar179,0xaa);
                        local_820 = vshufps_avx(auVar179,auVar179,0);
                        local_800 = ZEXT816(0) << 0x20;
                        local_7f0 = local_860._0_8_;
                        uStack_7e8 = local_860._8_8_;
                        local_7e0 = local_850;
                        vcmpps_avx(ZEXT1632(local_850),ZEXT1632(local_850),0xf);
                        uStack_7cc = context->user->instID[0];
                        local_7d0 = uStack_7cc;
                        uStack_7c8 = uStack_7cc;
                        uStack_7c4 = uStack_7cc;
                        uStack_7c0 = context->user->instPrimID[0];
                        uStack_7bc = uStack_7c0;
                        uStack_7b8 = uStack_7c0;
                        uStack_7b4 = uStack_7c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar347;
                        auVar237 = *(undefined1 (*) [16])
                                    (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        local_900._0_16_ = auVar237;
                        local_a50.valid = (int *)local_900;
                        local_a50.geometryUserPtr = pGVar10->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_840;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar297 = ZEXT1664(auVar189);
                          auVar353 = ZEXT1664(auVar353._0_16_);
                          auVar366 = ZEXT464((uint)fVar337);
                          auVar378 = ZEXT1664(auVar113);
                          (*pGVar10->occlusionFilterN)(&local_a50);
                          auVar237 = local_900._0_16_;
                        }
                        if (auVar237 == (undefined1  [16])0x0) {
                          auVar237 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar237 = auVar237 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            auVar353 = ZEXT1664(auVar353._0_16_);
                            auVar366 = ZEXT1664(auVar366._0_16_);
                            auVar378 = ZEXT1664(auVar378._0_16_);
                            (*p_Var15)(&local_a50);
                            auVar237 = local_900._0_16_;
                          }
                          auVar189 = vpcmpeqd_avx(auVar237,_DAT_01f45a50);
                          auVar237 = auVar189 ^ _DAT_01f46b70;
                          auVar185._8_4_ = 0xff800000;
                          auVar185._0_8_ = 0xff800000ff800000;
                          auVar185._12_4_ = 0xff800000;
                          auVar189 = vblendvps_avx(auVar185,*(undefined1 (*) [16])
                                                             (local_a50.ray + 0x80),auVar189);
                          *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar189;
                        }
                        auVar154._8_8_ = 0x100000001;
                        auVar154._0_8_ = 0x100000001;
                        bVar107 = (auVar154 & auVar237) != (undefined1  [16])0x0;
                        if (!(bool)bVar107) {
                          *(float *)(ray + k * 4 + 0x80) = fVar261;
                        }
                      }
                      goto LAB_008cc1db;
                    }
                  }
                  bVar107 = 0;
                  goto LAB_008cc1db;
                }
              }
            }
            bVar106 = false;
LAB_008cc1db:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar160._4_4_ = uVar8;
            auVar160._0_4_ = uVar8;
            auVar160._8_4_ = uVar8;
            auVar160._12_4_ = uVar8;
            auVar160._16_4_ = uVar8;
            auVar160._20_4_ = uVar8;
            auVar160._24_4_ = uVar8;
            auVar160._28_4_ = uVar8;
            bVar100 = bVar100 | bVar106 & bVar107;
            auVar34 = vcmpps_avx(_local_8e0,auVar160,2);
            local_4c0 = vandps_avx(auVar34,local_4c0);
          }
          auVar129._0_4_ = auVar35._0_4_ + fVar345;
          auVar129._4_4_ = auVar35._4_4_ + fVar300;
          auVar129._8_4_ = auVar35._8_4_ + fVar346;
          auVar129._12_4_ = auVar35._12_4_ + fVar302;
          auVar129._16_4_ = auVar35._16_4_ + fVar345;
          auVar129._20_4_ = auVar35._20_4_ + fVar300;
          auVar129._24_4_ = auVar35._24_4_ + fVar346;
          auVar129._28_4_ = auVar35._28_4_ + fVar302;
          auVar237 = vshufps_avx(auVar160._0_16_,auVar160._0_16_,0);
          auVar166._16_16_ = auVar237;
          auVar166._0_16_ = auVar237;
          auVar34 = vcmpps_avx(auVar129,auVar166,2);
          _local_8e0 = vandps_avx(auVar34,auVar122);
          auVar130._8_4_ = 3;
          auVar130._0_8_ = 0x300000003;
          auVar130._12_4_ = 3;
          auVar130._16_4_ = 3;
          auVar130._20_4_ = 3;
          auVar130._24_4_ = 3;
          auVar130._28_4_ = 3;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar122 = vblendvps_avx(auVar167,auVar130,local_700);
          auVar237 = vpcmpgtd_avx(auVar122._16_16_,local_740);
          auVar189 = vpshufd_avx(local_720._0_16_,0);
          auVar189 = vpcmpgtd_avx(auVar122._0_16_,auVar189);
          auVar168._16_16_ = auVar237;
          auVar168._0_16_ = auVar189;
          auVar122 = vblendps_avx(ZEXT1632(auVar189),auVar168,0xf0);
          local_900 = vandnps_avx(auVar122,_local_8e0);
          local_7a0 = _local_460;
          local_b60._4_4_ = fVar300 + (float)local_460._4_4_;
          local_b60._0_4_ = fVar345 + (float)local_460._0_4_;
          fStack_b58 = fVar346 + fStack_458;
          fStack_b54 = fVar302 + fStack_454;
          fStack_b50 = fVar345 + fStack_450;
          fStack_b4c = fVar300 + fStack_44c;
          fStack_b48 = fVar346 + fStack_448;
          fStack_b44 = fVar302 + fStack_444;
          for (; (((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_900 >> 0x7f,0) != '\0') ||
                   (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_900 >> 0xbf,0) != '\0') ||
                 (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_900[0x1f] < '\0'; local_900 = vandps_avx(auVar34,local_900)) {
            auVar169._8_4_ = 0x7f800000;
            auVar169._0_8_ = 0x7f8000007f800000;
            auVar169._12_4_ = 0x7f800000;
            auVar169._16_4_ = 0x7f800000;
            auVar169._20_4_ = 0x7f800000;
            auVar169._24_4_ = 0x7f800000;
            auVar169._28_4_ = 0x7f800000;
            auVar34 = vblendvps_avx(auVar169,local_7a0,local_900);
            auVar33 = vshufps_avx(auVar34,auVar34,0xb1);
            auVar33 = vminps_avx(auVar34,auVar33);
            auVar35 = vshufpd_avx(auVar33,auVar33,5);
            auVar33 = vminps_avx(auVar33,auVar35);
            auVar35 = vperm2f128_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar33,auVar35);
            auVar33 = vcmpps_avx(auVar34,auVar33,0);
            auVar35 = local_900 & auVar33;
            auVar34 = local_900;
            if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0x7f,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0xbf,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar35[0x1f] < '\0') {
              auVar34 = vandps_avx(auVar33,local_900);
            }
            uVar96 = vmovmskps_avx(auVar34);
            uVar105 = 0;
            if (uVar96 != 0) {
              for (; (uVar96 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
              }
            }
            uVar98 = (ulong)uVar105;
            *(undefined4 *)(local_900 + uVar98 * 4) = 0;
            fVar337 = local_1c0[uVar98];
            uVar105 = *(uint *)(local_440 + uVar98 * 4);
            fVar298 = auVar16._0_4_;
            if ((float)local_9d0._0_4_ < 0.0) {
              auVar353 = ZEXT1664(auVar353._0_16_);
              auVar366 = ZEXT1664(auVar366._0_16_);
              auVar378 = ZEXT1664(auVar378._0_16_);
              fVar298 = sqrtf((float)local_9d0._0_4_);
              uVar98 = extraout_RAX_03;
            }
            auVar297 = ZEXT464(uVar105);
            auVar189 = vminps_avx(auVar28,auVar30);
            auVar237 = vmaxps_avx(auVar28,auVar30);
            auVar179 = vminps_avx(auVar29,auVar17);
            auVar113 = vminps_avx(auVar189,auVar179);
            auVar189 = vmaxps_avx(auVar29,auVar17);
            auVar179 = vmaxps_avx(auVar237,auVar189);
            auVar210._8_4_ = 0x7fffffff;
            auVar210._0_8_ = 0x7fffffff7fffffff;
            auVar210._12_4_ = 0x7fffffff;
            auVar237 = vandps_avx(auVar113,auVar210);
            auVar189 = vandps_avx(auVar179,auVar210);
            auVar237 = vmaxps_avx(auVar237,auVar189);
            auVar189 = vmovshdup_avx(auVar237);
            auVar189 = vmaxss_avx(auVar189,auVar237);
            auVar237 = vshufpd_avx(auVar237,auVar237,1);
            auVar237 = vmaxss_avx(auVar237,auVar189);
            fVar347 = auVar237._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar298 * 1.9073486e-06;
            local_9c0._0_16_ = vshufps_avx(auVar179,auVar179,0xff);
            auVar237 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar337),0x10);
            for (uVar104 = 0; bVar107 = (byte)uVar98, uVar104 != 5; uVar104 = uVar104 + 1) {
              auVar189 = vmovshdup_avx(auVar237);
              fVar337 = auVar189._0_4_;
              fVar274 = 1.0 - fVar337;
              fVar298 = fVar274 * fVar274 * fVar274;
              fVar261 = fVar337 * fVar337 * fVar337;
              fVar270 = fVar337 * fVar274;
              auVar189 = vshufps_avx(ZEXT416((uint)(fVar261 * 0.16666667)),
                                     ZEXT416((uint)(fVar261 * 0.16666667)),0);
              auVar179 = ZEXT416((uint)((fVar261 * 4.0 + fVar298 +
                                        fVar337 * fVar270 * 12.0 + fVar274 * fVar270 * 6.0) *
                                       0.16666667));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar113 = ZEXT416((uint)((fVar298 * 4.0 + fVar261 +
                                        fVar274 * fVar270 * 12.0 + fVar337 * fVar270 * 6.0) *
                                       0.16666667));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar109 = vshufps_avx(auVar237,auVar237,0);
              auVar186._0_4_ = auVar109._0_4_ * fVar108 + 0.0;
              auVar186._4_4_ = auVar109._4_4_ * fVar133 + 0.0;
              auVar186._8_4_ = auVar109._8_4_ * fVar135 + 0.0;
              auVar186._12_4_ = auVar109._12_4_ * fVar137 + 0.0;
              auVar109 = vshufps_avx(ZEXT416((uint)(fVar298 * 0.16666667)),
                                     ZEXT416((uint)(fVar298 * 0.16666667)),0);
              auVar117._0_4_ =
                   auVar109._0_4_ * (float)local_bf0._0_4_ +
                   auVar113._0_4_ * local_bd0 +
                   auVar189._0_4_ * (float)local_be0._0_4_ + auVar179._0_4_ * local_c30;
              auVar117._4_4_ =
                   auVar109._4_4_ * (float)local_bf0._4_4_ +
                   auVar113._4_4_ * fStack_bcc +
                   auVar189._4_4_ * (float)local_be0._4_4_ + auVar179._4_4_ * fStack_c2c;
              auVar117._8_4_ =
                   auVar109._8_4_ * fStack_be8 +
                   auVar113._8_4_ * fStack_bc8 +
                   auVar189._8_4_ * fStack_bd8 + auVar179._8_4_ * fStack_c28;
              auVar117._12_4_ =
                   auVar109._12_4_ * fStack_be4 +
                   auVar113._12_4_ * fStack_bc4 +
                   auVar189._12_4_ * fStack_bd4 + auVar179._12_4_ * fStack_c24;
              local_a20._0_16_ = auVar117;
              auVar189 = vsubps_avx(auVar186,auVar117);
              local_9a0 = auVar189._0_4_;
              fStack_99c = auVar189._4_4_;
              fStack_998 = auVar189._8_4_;
              fStack_994 = auVar189._12_4_;
              auVar189 = vdpps_avx(auVar189,auVar189,0x7f);
              fVar298 = auVar189._0_4_;
              if (fVar298 < 0.0) {
                fVar261 = sqrtf(fVar298);
                uVar98 = extraout_RAX_04;
              }
              else {
                auVar179 = vsqrtss_avx(auVar189,auVar189);
                fVar261 = auVar179._0_4_;
              }
              auVar179 = ZEXT416((uint)(fVar337 * fVar337 * 0.5));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar113 = ZEXT416((uint)((fVar274 * fVar274 + fVar270 * 4.0) * 0.5));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar109 = ZEXT416((uint)((fVar337 * -fVar337 - fVar270 * 4.0) * 0.5));
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              auVar112 = ZEXT416((uint)(fVar274 * -fVar274 * 0.5));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar313._0_4_ =
                   (float)local_bf0._0_4_ * auVar112._0_4_ +
                   local_bd0 * auVar109._0_4_ +
                   (float)local_be0._0_4_ * auVar179._0_4_ + local_c30 * auVar113._0_4_;
              auVar313._4_4_ =
                   (float)local_bf0._4_4_ * auVar112._4_4_ +
                   fStack_bcc * auVar109._4_4_ +
                   (float)local_be0._4_4_ * auVar179._4_4_ + fStack_c2c * auVar113._4_4_;
              auVar313._8_4_ =
                   fStack_be8 * auVar112._8_4_ +
                   fStack_bc8 * auVar109._8_4_ +
                   fStack_bd8 * auVar179._8_4_ + fStack_c28 * auVar113._8_4_;
              auVar313._12_4_ =
                   fStack_be4 * auVar112._12_4_ +
                   fStack_bc4 * auVar109._12_4_ +
                   fStack_bd4 * auVar179._12_4_ + fStack_c24 * auVar113._12_4_;
              auVar179 = vshufps_avx(auVar237,auVar237,0x55);
              auVar113 = ZEXT416((uint)(fVar274 - (fVar337 + fVar337)));
              auVar109 = vshufps_avx(auVar113,auVar113,0);
              auVar113 = ZEXT416((uint)(fVar337 - (fVar274 + fVar274)));
              auVar112 = vshufps_avx(auVar113,auVar113,0);
              auVar148 = vshufps_avx(ZEXT416((uint)fVar274),ZEXT416((uint)fVar274),0);
              auVar113 = vdpps_avx(auVar313,auVar313,0x7f);
              auVar155._0_4_ =
                   (float)local_bf0._0_4_ * auVar148._0_4_ +
                   local_bd0 * auVar112._0_4_ +
                   (float)local_be0._0_4_ * auVar179._0_4_ + local_c30 * auVar109._0_4_;
              auVar155._4_4_ =
                   (float)local_bf0._4_4_ * auVar148._4_4_ +
                   fStack_bcc * auVar112._4_4_ +
                   (float)local_be0._4_4_ * auVar179._4_4_ + fStack_c2c * auVar109._4_4_;
              auVar155._8_4_ =
                   fStack_be8 * auVar148._8_4_ +
                   fStack_bc8 * auVar112._8_4_ +
                   fStack_bd8 * auVar179._8_4_ + fStack_c28 * auVar109._8_4_;
              auVar155._12_4_ =
                   fStack_be4 * auVar148._12_4_ +
                   fStack_bc4 * auVar112._12_4_ +
                   fStack_bd4 * auVar179._12_4_ + fStack_c24 * auVar109._12_4_;
              auVar179 = vblendps_avx(auVar113,_DAT_01f45a50,0xe);
              auVar109 = vrsqrtss_avx(auVar179,auVar179);
              fVar270 = auVar109._0_4_;
              fVar337 = auVar113._0_4_;
              auVar109 = vdpps_avx(auVar313,auVar155,0x7f);
              auVar112 = vshufps_avx(auVar113,auVar113,0);
              auVar156._0_4_ = auVar155._0_4_ * auVar112._0_4_;
              auVar156._4_4_ = auVar155._4_4_ * auVar112._4_4_;
              auVar156._8_4_ = auVar155._8_4_ * auVar112._8_4_;
              auVar156._12_4_ = auVar155._12_4_ * auVar112._12_4_;
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              auVar223._0_4_ = auVar313._0_4_ * auVar109._0_4_;
              auVar223._4_4_ = auVar313._4_4_ * auVar109._4_4_;
              auVar223._8_4_ = auVar313._8_4_ * auVar109._8_4_;
              auVar223._12_4_ = auVar313._12_4_ * auVar109._12_4_;
              auVar148 = vsubps_avx(auVar156,auVar223);
              auVar109 = vrcpss_avx(auVar179,auVar179);
              auVar179 = vmaxss_avx(ZEXT416((uint)fVar347),
                                    ZEXT416((uint)(auVar237._0_4_ * (float)local_980._0_4_)));
              auVar297 = ZEXT1664(auVar179);
              auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - fVar337 * auVar109._0_4_)));
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              uVar86 = CONCAT44(auVar313._4_4_,auVar313._0_4_);
              auVar240._0_8_ = uVar86 ^ 0x8000000080000000;
              auVar240._8_4_ = -auVar313._8_4_;
              auVar240._12_4_ = -auVar313._12_4_;
              auVar112 = ZEXT416((uint)(fVar270 * 1.5 + fVar337 * -0.5 * fVar270 * fVar270 * fVar270
                                       ));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar211._0_4_ = auVar112._0_4_ * auVar148._0_4_ * auVar109._0_4_;
              auVar211._4_4_ = auVar112._4_4_ * auVar148._4_4_ * auVar109._4_4_;
              auVar211._8_4_ = auVar112._8_4_ * auVar148._8_4_ * auVar109._8_4_;
              auVar211._12_4_ = auVar112._12_4_ * auVar148._12_4_ * auVar109._12_4_;
              auVar266._0_4_ = auVar313._0_4_ * auVar112._0_4_;
              auVar266._4_4_ = auVar313._4_4_ * auVar112._4_4_;
              auVar266._8_4_ = auVar313._8_4_ * auVar112._8_4_;
              auVar266._12_4_ = auVar313._12_4_ * auVar112._12_4_;
              if (fVar337 < 0.0) {
                local_a00._0_16_ = auVar211;
                fVar337 = sqrtf(fVar337);
                auVar297 = ZEXT464(auVar179._0_4_);
                uVar98 = extraout_RAX_05;
                auVar211 = local_a00._0_16_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                fVar337 = auVar113._0_4_;
              }
              auVar92._4_4_ = fStack_99c;
              auVar92._0_4_ = local_9a0;
              auVar92._8_4_ = fStack_998;
              auVar92._12_4_ = fStack_994;
              auVar113 = vdpps_avx(auVar92,auVar266,0x7f);
              fVar337 = (fVar347 / fVar337) * (fVar261 + 1.0) + fVar261 * fVar347 + auVar297._0_4_;
              auVar109 = vdpps_avx(auVar240,auVar266,0x7f);
              auVar112 = vdpps_avx(auVar92,auVar211,0x7f);
              auVar148 = vdpps_avx(auVar26,auVar266,0x7f);
              auVar147 = vdpps_avx(auVar92,auVar240,0x7f);
              fVar261 = auVar109._0_4_ + auVar112._0_4_;
              fVar270 = auVar113._0_4_;
              auVar118._0_4_ = fVar270 * fVar270;
              auVar118._4_4_ = auVar113._4_4_ * auVar113._4_4_;
              auVar118._8_4_ = auVar113._8_4_ * auVar113._8_4_;
              auVar118._12_4_ = auVar113._12_4_ * auVar113._12_4_;
              auVar112 = vsubps_avx(auVar189,auVar118);
              auVar109 = vdpps_avx(auVar92,auVar26,0x7f);
              fVar274 = auVar147._0_4_ - fVar270 * fVar261;
              fVar278 = auVar109._0_4_ - fVar270 * auVar148._0_4_;
              auVar109 = vrsqrtss_avx(auVar112,auVar112);
              fVar233 = auVar112._0_4_;
              fVar270 = auVar109._0_4_;
              fVar270 = fVar270 * 1.5 + fVar233 * -0.5 * fVar270 * fVar270 * fVar270;
              if (fVar233 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)fVar261);
                local_880._0_4_ = fVar274;
                local_8a0._0_4_ = fVar278;
                local_8c0._0_4_ = fVar270;
                fVar233 = sqrtf(fVar233);
                auVar297 = ZEXT464(auVar179._0_4_);
                uVar98 = extraout_RAX_06;
                fVar270 = (float)local_8c0._0_4_;
                fVar274 = (float)local_880._0_4_;
                fVar278 = (float)local_8a0._0_4_;
                auVar179 = local_a00._0_16_;
              }
              else {
                auVar179 = vsqrtss_avx(auVar112,auVar112);
                fVar233 = auVar179._0_4_;
                auVar179 = ZEXT416((uint)fVar261);
              }
              auVar378 = ZEXT464((uint)fVar337);
              auVar366 = ZEXT1664(auVar113);
              auVar353 = ZEXT1664(auVar313);
              auVar153 = vpermilps_avx(local_a20._0_16_,0xff);
              auVar147 = vshufps_avx(auVar313,auVar313,0xff);
              fVar261 = fVar274 * fVar270 - auVar147._0_4_;
              auVar224._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar148._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar148._12_4_ ^ 0x80000000;
              auVar241._0_4_ = -fVar261;
              auVar241._4_4_ = 0x80000000;
              auVar241._8_4_ = 0x80000000;
              auVar241._12_4_ = 0x80000000;
              auVar109 = vinsertps_avx(auVar241,ZEXT416((uint)(fVar278 * fVar270)),0x1c);
              auVar112 = vmovsldup_avx(ZEXT416((uint)(auVar179._0_4_ * fVar278 * fVar270 -
                                                     auVar148._0_4_ * fVar261)));
              auVar109 = vdivps_avx(auVar109,auVar112);
              auVar179 = vinsertps_avx(auVar179,auVar224,0x10);
              auVar179 = vdivps_avx(auVar179,auVar112);
              auVar112 = vmovsldup_avx(auVar113);
              auVar153 = ZEXT416((uint)(fVar233 - auVar153._0_4_));
              auVar148 = vmovsldup_avx(auVar153);
              auVar187._0_4_ = auVar112._0_4_ * auVar109._0_4_ + auVar148._0_4_ * auVar179._0_4_;
              auVar187._4_4_ = auVar112._4_4_ * auVar109._4_4_ + auVar148._4_4_ * auVar179._4_4_;
              auVar187._8_4_ = auVar112._8_4_ * auVar109._8_4_ + auVar148._8_4_ * auVar179._8_4_;
              auVar187._12_4_ =
                   auVar112._12_4_ * auVar109._12_4_ + auVar148._12_4_ * auVar179._12_4_;
              auVar237 = vsubps_avx(auVar237,auVar187);
              auVar188._8_4_ = 0x7fffffff;
              auVar188._0_8_ = 0x7fffffff7fffffff;
              auVar188._12_4_ = 0x7fffffff;
              auVar179 = vandps_avx(auVar113,auVar188);
              if (auVar179._0_4_ < fVar337) {
                auVar212._8_4_ = 0x7fffffff;
                auVar212._0_8_ = 0x7fffffff7fffffff;
                auVar212._12_4_ = 0x7fffffff;
                auVar179 = vandps_avx(auVar153,auVar212);
                if (auVar179._0_4_ <
                    (float)local_9c0._0_4_ * 1.9073486e-06 + fVar337 + auVar297._0_4_) {
                  bVar106 = uVar104 < 5;
                  fVar347 = auVar237._0_4_ + (float)local_950._0_4_;
                  if (fVar347 < fVar291) {
                    bVar107 = 0;
                    goto LAB_008cccd4;
                  }
                  fVar261 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar347 <= fVar261) {
                    auVar179 = vmovshdup_avx(auVar237);
                    bVar107 = 0;
                    if ((auVar179._0_4_ < 0.0) || (1.0 < auVar179._0_4_)) goto LAB_008cccd4;
                    auVar189 = vrsqrtss_avx(auVar189,auVar189);
                    fVar270 = auVar189._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar101].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar107 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar189 = ZEXT416((uint)(fVar270 * 1.5 +
                                                 fVar298 * -0.5 * fVar270 * fVar270 * fVar270));
                        auVar189 = vshufps_avx(auVar189,auVar189,0);
                        auVar190._0_4_ = auVar189._0_4_ * local_9a0;
                        auVar190._4_4_ = auVar189._4_4_ * fStack_99c;
                        auVar190._8_4_ = auVar189._8_4_ * fStack_998;
                        auVar190._12_4_ = auVar189._12_4_ * fStack_994;
                        auVar119._0_4_ = auVar313._0_4_ + auVar147._0_4_ * auVar190._0_4_;
                        auVar119._4_4_ = auVar313._4_4_ + auVar147._4_4_ * auVar190._4_4_;
                        auVar119._8_4_ = auVar313._8_4_ + auVar147._8_4_ * auVar190._8_4_;
                        auVar119._12_4_ = auVar313._12_4_ + auVar147._12_4_ * auVar190._12_4_;
                        auVar189 = vshufps_avx(auVar190,auVar190,0xc9);
                        auVar179 = vshufps_avx(auVar313,auVar313,0xc9);
                        auVar191._0_4_ = auVar179._0_4_ * auVar190._0_4_;
                        auVar191._4_4_ = auVar179._4_4_ * auVar190._4_4_;
                        auVar191._8_4_ = auVar179._8_4_ * auVar190._8_4_;
                        auVar191._12_4_ = auVar179._12_4_ * auVar190._12_4_;
                        auVar213._0_4_ = auVar313._0_4_ * auVar189._0_4_;
                        auVar213._4_4_ = auVar313._4_4_ * auVar189._4_4_;
                        auVar213._8_4_ = auVar313._8_4_ * auVar189._8_4_;
                        auVar213._12_4_ = auVar313._12_4_ * auVar189._12_4_;
                        auVar109 = vsubps_avx(auVar213,auVar191);
                        auVar189 = vshufps_avx(auVar109,auVar109,0xc9);
                        auVar179 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar214._0_4_ = auVar179._0_4_ * auVar189._0_4_;
                        auVar214._4_4_ = auVar179._4_4_ * auVar189._4_4_;
                        auVar214._8_4_ = auVar179._8_4_ * auVar189._8_4_;
                        auVar214._12_4_ = auVar179._12_4_ * auVar189._12_4_;
                        auVar189 = vshufps_avx(auVar109,auVar109,0xd2);
                        auVar120._0_4_ = auVar119._0_4_ * auVar189._0_4_;
                        auVar120._4_4_ = auVar119._4_4_ * auVar189._4_4_;
                        auVar120._8_4_ = auVar119._8_4_ * auVar189._8_4_;
                        auVar120._12_4_ = auVar119._12_4_ * auVar189._12_4_;
                        auVar189 = vsubps_avx(auVar214,auVar120);
                        local_810 = vshufps_avx(auVar237,auVar237,0x55);
                        local_840 = (RTCHitN  [16])vshufps_avx(auVar189,auVar189,0x55);
                        auStack_830 = vshufps_avx(auVar189,auVar189,0xaa);
                        local_820 = vshufps_avx(auVar189,auVar189,0);
                        local_800 = ZEXT816(0) << 0x20;
                        local_7f0 = local_860._0_8_;
                        uStack_7e8 = local_860._8_8_;
                        local_7e0 = local_850;
                        vcmpps_avx(ZEXT1632(local_850),ZEXT1632(local_850),0xf);
                        uStack_7cc = context->user->instID[0];
                        local_7d0 = uStack_7cc;
                        uStack_7c8 = uStack_7cc;
                        uStack_7c4 = uStack_7cc;
                        uStack_7c0 = context->user->instPrimID[0];
                        uStack_7bc = uStack_7c0;
                        uStack_7b8 = uStack_7c0;
                        uStack_7b4 = uStack_7c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar347;
                        local_940 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        local_a50.valid = (int *)local_940;
                        local_a50.geometryUserPtr = pGVar10->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_840;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar297 = ZEXT1664(auVar297._0_16_);
                          auVar353 = ZEXT1664(auVar313);
                          auVar366 = ZEXT1664(auVar113);
                          auVar378 = ZEXT464((uint)fVar337);
                          (*pGVar10->occlusionFilterN)(&local_a50);
                        }
                        if (local_940 == (undefined1  [16])0x0) {
                          auVar237 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar237 = auVar237 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            auVar353 = ZEXT1664(auVar353._0_16_);
                            auVar366 = ZEXT1664(auVar366._0_16_);
                            auVar378 = ZEXT1664(auVar378._0_16_);
                            (*p_Var15)(&local_a50);
                          }
                          auVar189 = vpcmpeqd_avx(local_940,_DAT_01f45a50);
                          auVar237 = auVar189 ^ _DAT_01f46b70;
                          auVar192._8_4_ = 0xff800000;
                          auVar192._0_8_ = 0xff800000ff800000;
                          auVar192._12_4_ = 0xff800000;
                          auVar189 = vblendvps_avx(auVar192,*(undefined1 (*) [16])
                                                             (local_a50.ray + 0x80),auVar189);
                          *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar189;
                        }
                        auVar157._8_8_ = 0x100000001;
                        auVar157._0_8_ = 0x100000001;
                        bVar107 = (auVar157 & auVar237) != (undefined1  [16])0x0;
                        if (!(bool)bVar107) {
                          *(float *)(ray + k * 4 + 0x80) = fVar261;
                        }
                      }
                      goto LAB_008cccd4;
                    }
                  }
                  bVar107 = 0;
                  goto LAB_008cccd4;
                }
              }
            }
            bVar106 = false;
LAB_008cccd4:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar160._4_4_ = uVar8;
            auVar160._0_4_ = uVar8;
            auVar160._8_4_ = uVar8;
            auVar160._12_4_ = uVar8;
            auVar160._16_4_ = uVar8;
            auVar160._20_4_ = uVar8;
            auVar160._24_4_ = uVar8;
            auVar160._28_4_ = uVar8;
            bVar100 = bVar100 | bVar106 & bVar107;
            auVar34 = vcmpps_avx(_local_b60,auVar160,2);
          }
          auVar34 = vandps_avx(local_6e0,local_6c0);
          auVar122 = vandps_avx(auVar122,_local_8e0);
          auVar196._0_4_ = fVar345 + local_4a0._0_4_;
          auVar196._4_4_ = fVar300 + local_4a0._4_4_;
          auVar196._8_4_ = fVar346 + local_4a0._8_4_;
          auVar196._12_4_ = fVar302 + local_4a0._12_4_;
          auVar196._16_4_ = fVar345 + local_4a0._16_4_;
          auVar196._20_4_ = fVar300 + local_4a0._20_4_;
          auVar196._24_4_ = fVar346 + local_4a0._24_4_;
          auVar196._28_4_ = fVar302 + local_4a0._28_4_;
          auVar237 = vshufps_avx(auVar160._0_16_,auVar160._0_16_,0);
          auVar232._16_16_ = auVar237;
          auVar232._0_16_ = auVar237;
          auVar33 = vcmpps_avx(auVar196,auVar232,2);
          auVar34 = vandps_avx(auVar33,auVar34);
          auVar250._0_4_ = fVar345 + local_460._0_4_;
          auVar250._4_4_ = fVar300 + local_460._4_4_;
          auVar250._8_4_ = fVar346 + local_460._8_4_;
          auVar250._12_4_ = fVar302 + local_460._12_4_;
          auVar250._16_4_ = fVar345 + local_460._16_4_;
          auVar250._20_4_ = fVar300 + local_460._20_4_;
          auVar250._24_4_ = fVar346 + local_460._24_4_;
          auVar250._28_4_ = fVar302 + local_460._28_4_;
          auVar33 = vcmpps_avx(auVar250,auVar232,2);
          auVar122 = vandps_avx(auVar33,auVar122);
          auVar122 = vorps_avx(auVar34,auVar122);
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar122;
            auVar122 = vblendvps_avx(_local_460,_local_4a0,auVar34);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar122;
            uVar98 = vmovlps_avx(local_690);
            (&uStack_140)[uVar97 * 0xc] = uVar98;
            auStack_138[uVar97 * 0x18] = local_c88 + 1;
            uVar97 = (ulong)((int)uVar97 + 1);
          }
          auVar344 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
      }
    }
    while( true ) {
      auVar269 = ZEXT3264(CONCAT1616(auVar27,auVar27));
      uVar105 = (uint)uVar97;
      if (uVar105 == 0) {
        if (bVar100 != 0) goto LAB_008cd31e;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar121._4_4_ = uVar8;
        auVar121._0_4_ = uVar8;
        auVar121._8_4_ = uVar8;
        auVar121._12_4_ = uVar8;
        auVar18 = vcmpps_avx(local_6a0,auVar121,2);
        uVar101 = vmovmskps_avx(auVar18);
        uVar101 = (uint)local_928 - 1 & (uint)local_928 & uVar101;
        goto LAB_008ca772;
      }
      uVar97 = (ulong)(uVar105 - 1);
      lVar102 = uVar97 * 0x60;
      auVar122 = *(undefined1 (*) [32])(auStack_160 + lVar102);
      auVar131._0_4_ = fVar345 + auVar122._0_4_;
      auVar131._4_4_ = fVar300 + auVar122._4_4_;
      auVar131._8_4_ = fVar346 + auVar122._8_4_;
      auVar131._12_4_ = fVar302 + auVar122._12_4_;
      auVar131._16_4_ = fVar345 + auVar122._16_4_;
      auVar131._20_4_ = fVar300 + auVar122._20_4_;
      auVar131._24_4_ = fVar346 + auVar122._24_4_;
      auVar131._28_4_ = fVar302 + auVar122._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar216._4_4_ = uVar8;
      auVar216._0_4_ = uVar8;
      auVar216._8_4_ = uVar8;
      auVar216._12_4_ = uVar8;
      auVar216._16_4_ = uVar8;
      auVar216._20_4_ = uVar8;
      auVar216._24_4_ = uVar8;
      auVar216._28_4_ = uVar8;
      auVar34 = vcmpps_avx(auVar131,auVar216,2);
      _local_840 = vandps_avx(auVar34,*(undefined1 (*) [32])(auStack_180 + lVar102));
      auVar34 = *(undefined1 (*) [32])(auStack_180 + lVar102) & auVar34;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') break;
      uVar97 = (ulong)(uVar105 - 1);
    }
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar122 = vblendvps_avx(auVar197,auVar122,_local_840);
    auVar34 = vshufps_avx(auVar122,auVar122,0xb1);
    auVar34 = vminps_avx(auVar122,auVar34);
    auVar33 = vshufpd_avx(auVar34,auVar34,5);
    auVar34 = vminps_avx(auVar34,auVar33);
    auVar33 = vperm2f128_avx(auVar34,auVar34,1);
    auVar34 = vminps_avx(auVar34,auVar33);
    auVar34 = vcmpps_avx(auVar122,auVar34,0);
    auVar33 = _local_840 & auVar34;
    auVar122 = _local_840;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      auVar122 = vandps_avx(auVar34,_local_840);
    }
    auVar158._8_8_ = 0;
    auVar158._0_8_ = (&uStack_140)[uVar97 * 0xc];
    local_c88 = auStack_138[uVar97 * 0x18];
    uVar99 = vmovmskps_avx(auVar122);
    uVar96 = 0;
    if (uVar99 != 0) {
      for (; (uVar99 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
      }
    }
    *(undefined4 *)(local_840 + (ulong)uVar96 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar102) = _local_840;
    uVar99 = uVar105 - 1;
    if ((((((((_local_840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_840 >> 0x7f,0) != '\0') ||
          (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_840 >> 0xbf,0) != '\0') ||
        (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_840[0x1f] < '\0') {
      uVar99 = uVar105;
    }
    auVar237 = vshufps_avx(auVar158,auVar158,0);
    auVar189 = vshufps_avx(auVar158,auVar158,0x55);
    auVar189 = vsubps_avx(auVar189,auVar237);
    local_4a0._4_4_ = auVar237._4_4_ + auVar189._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar237._0_4_ + auVar189._0_4_ * 0.0;
    fStack_498 = auVar237._8_4_ + auVar189._8_4_ * 0.2857143;
    fStack_494 = auVar237._12_4_ + auVar189._12_4_ * 0.42857146;
    fStack_490 = auVar237._0_4_ + auVar189._0_4_ * 0.5714286;
    fStack_48c = auVar237._4_4_ + auVar189._4_4_ * 0.71428573;
    fStack_488 = auVar237._8_4_ + auVar189._8_4_ * 0.8571429;
    fStack_484 = auVar237._12_4_ + auVar189._12_4_;
    local_690._8_8_ = 0;
    local_690._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar96 * 4);
    uVar97 = (ulong)uVar99;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }